

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void pbrt::parse(SceneRepresentation *scene,
                unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *t)

{
  undefined8 uVar1;
  size_t sVar2;
  char **ppcVar3;
  string_view str;
  Token t_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_11;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_12;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_13;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_14;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_15;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_16;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_17;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_18;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_19;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_20;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_21;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_22;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_23;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_24;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_25;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_26;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_27;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_28;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_29;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_30;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_31;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_32;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_33;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_34;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_35;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_36;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_37;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_38;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_39;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_40;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_41;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_42;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_43;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_44;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_45;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  basic_string_view<char,_std::char_traits<char>_> __x_11;
  basic_string_view<char,_std::char_traits<char>_> __x_12;
  basic_string_view<char,_std::char_traits<char>_> __x_13;
  basic_string_view<char,_std::char_traits<char>_> __x_14;
  basic_string_view<char,_std::char_traits<char>_> __x_15;
  basic_string_view<char,_std::char_traits<char>_> __x_16;
  basic_string_view<char,_std::char_traits<char>_> __x_17;
  basic_string_view<char,_std::char_traits<char>_> __x_18;
  basic_string_view<char,_std::char_traits<char>_> __x_19;
  basic_string_view<char,_std::char_traits<char>_> __x_20;
  basic_string_view<char,_std::char_traits<char>_> __x_21;
  basic_string_view<char,_std::char_traits<char>_> __x_22;
  basic_string_view<char,_std::char_traits<char>_> __x_23;
  basic_string_view<char,_std::char_traits<char>_> __x_24;
  basic_string_view<char,_std::char_traits<char>_> __x_25;
  basic_string_view<char,_std::char_traits<char>_> __x_26;
  basic_string_view<char,_std::char_traits<char>_> __x_27;
  basic_string_view<char,_std::char_traits<char>_> __x_28;
  basic_string_view<char,_std::char_traits<char>_> __x_29;
  basic_string_view<char,_std::char_traits<char>_> __x_30;
  basic_string_view<char,_std::char_traits<char>_> __x_31;
  basic_string_view<char,_std::char_traits<char>_> __x_32;
  basic_string_view<char,_std::char_traits<char>_> __x_33;
  basic_string_view<char,_std::char_traits<char>_> __x_34;
  basic_string_view<char,_std::char_traits<char>_> __x_35;
  basic_string_view<char,_std::char_traits<char>_> __x_36;
  basic_string_view<char,_std::char_traits<char>_> __x_37;
  basic_string_view<char,_std::char_traits<char>_> __x_38;
  basic_string_view<char,_std::char_traits<char>_> __x_39;
  basic_string_view<char,_std::char_traits<char>_> __x_40;
  basic_string_view<char,_std::char_traits<char>_> __x_41;
  basic_string_view<char,_std::char_traits<char>_> __x_42;
  basic_string_view<char,_std::char_traits<char>_> __x_43;
  basic_string_view<char,_std::char_traits<char>_> __x_44;
  basic_string_view<char,_std::char_traits<char>_> __x_45;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  string_view s_03;
  string_view s_04;
  string_view s_05;
  string_view s_06;
  string_view s_07;
  string_view s_08;
  string_view s_09;
  string_view s_10;
  string_view s_11;
  FileLoc loc;
  FileLoc loc_00;
  FileLoc loc_01;
  FileLoc loc_02;
  FileLoc loc_03;
  FileLoc loc_04;
  FileLoc loc_05;
  FileLoc loc_06;
  FileLoc loc_07;
  FileLoc loc_08;
  FileLoc loc_09;
  FileLoc loc_10;
  FileLoc loc_11;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  bool bVar12;
  Token *pTVar13;
  const_reference pvVar14;
  Token *pTVar15;
  Token *in_RDI;
  double dVar16;
  string_view sVar17;
  string_view sVar18;
  ParsedParameterVector params;
  string texName;
  string_view dequoted;
  Token t_1;
  string type;
  string name_1;
  string_view n_7;
  int i_6;
  Float v_4 [2];
  int i_5;
  Float v_3 [3];
  int i_4;
  Float m_1 [16];
  int i_3;
  Float v_2 [3];
  int i_2;
  Float v_1 [4];
  string value;
  string name;
  string_view n_6;
  string_view n_5;
  string_view n_4;
  optional<pbrt::Token> second;
  string names [2];
  string_view n_3;
  int i_1;
  Float v [9];
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> tinc;
  string filename;
  Token filenameToken;
  string_view n_2;
  string_view n_1;
  string_view n;
  int i;
  Float m [16];
  Token a;
  CheckCallbackScope _;
  optional<pbrt::Token> tok;
  anon_class_1_0_00000001 syntaxError;
  anon_class_48_6_0442aee5 basicParamListEntrypoint;
  anon_class_8_1_6da50f9a unget;
  function<pstd::optional<pbrt::Token>_(int)> nextToken;
  anon_class_1_0_00000001 parseError;
  optional<pbrt::Token> ungetToken;
  vector<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
  fileStack;
  Allocator alloc;
  TrackedMemoryResource memoryResource;
  bool formatting;
  undefined4 in_stack_ffffffffffffdf78;
  undefined4 in_stack_ffffffffffffdf7c;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_ffffffffffffdf80;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_ffffffffffffdf88;
  undefined4 in_stack_ffffffffffffdf90;
  int in_stack_ffffffffffffdf94;
  anon_class_40_5_58554319 *in_stack_ffffffffffffdf98;
  undefined4 in_stack_ffffffffffffdfa0;
  int in_stack_ffffffffffffdfa4;
  FormattingScene *in_stack_ffffffffffffdfa8;
  Token *in_stack_ffffffffffffdfb0;
  Token *in_stack_ffffffffffffdfb8;
  Token *in_stack_ffffffffffffdfc0;
  Token *in_stack_ffffffffffffdfc8;
  Token *in_stack_ffffffffffffdfd0;
  Token *in_stack_ffffffffffffdfe8;
  string *in_stack_ffffffffffffe018;
  undefined4 in_stack_ffffffffffffe088;
  float in_stack_ffffffffffffe08c;
  float in_stack_ffffffffffffe160;
  float in_stack_ffffffffffffe164;
  Token *in_stack_ffffffffffffe168;
  float in_stack_ffffffffffffe1c0;
  float in_stack_ffffffffffffe1c4;
  anon_class_48_6_0442aee5 *in_stack_ffffffffffffe1d0;
  Token *in_stack_ffffffffffffe1f0;
  Token *in_stack_ffffffffffffe1f8;
  Token *in_stack_ffffffffffffe200;
  char *in_stack_ffffffffffffe2e8;
  size_t in_stack_ffffffffffffe2f0;
  Token *in_stack_ffffffffffffe2f8;
  Allocator in_stack_ffffffffffffe300;
  anon_class_8_1_6da50f9a in_stack_ffffffffffffe308;
  string *local_1cc8;
  string *local_1c50;
  long local_1900;
  undefined1 local_1870 [96];
  undefined1 *local_1810;
  memory_resource *local_17e8;
  optional<pbrt::Token> *local_17e0;
  string_view local_1758;
  string local_1748 [32];
  string_view local_1728;
  size_t local_16e8;
  char *pcStack_16e0;
  size_t sStack_16d8;
  char *pcStack_16d0;
  undefined8 local_16c8;
  string_view local_16b8;
  string local_16a8 [80];
  string_view local_1658;
  string_view local_1648;
  string local_1638 [80];
  string_view local_15e8;
  size_t local_15c8;
  char *local_15c0;
  size_t local_15b8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_15b0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_15a8;
  int local_1564;
  float local_1560 [6];
  size_t local_1548;
  char *local_1540;
  size_t local_1538;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_1530;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_1528;
  int local_14e8;
  float local_14e4 [7];
  size_t local_14c8;
  char *local_14c0;
  size_t local_14b8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_14b0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_14a8;
  size_t local_1460;
  char *local_1458;
  int local_141c;
  float local_1418 [32];
  size_t local_1398;
  char *local_1390;
  size_t local_1378;
  char *local_1370;
  size_t local_1368;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_1360;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_1358;
  size_t local_1338;
  char *local_1330;
  size_t local_1328;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_1320;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_1318;
  size_t local_12f8;
  char *local_12f0;
  size_t local_12e8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_12e0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_12d8;
  int local_1298;
  float local_1294 [7];
  size_t local_1278;
  char *local_1270;
  undefined8 local_1268;
  undefined8 local_1260;
  size_t local_1258;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_1250;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_1248;
  size_t local_1228;
  char *local_1220;
  undefined8 local_1218;
  undefined8 local_1210;
  size_t local_1208;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_1200;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_11f8;
  size_t local_11d8;
  char *local_11d0;
  size_t local_11c8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_11c0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_11b8;
  int local_117c;
  float local_1178 [8];
  size_t local_1158;
  char *local_1150;
  size_t local_1148;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_1140;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_1138;
  size_t local_1118;
  char *local_1110;
  undefined8 local_1108;
  undefined8 local_1100;
  size_t local_10f8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_10f0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_10e8;
  size_t local_10c8;
  char *local_10c0;
  size_t local_10b8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_10b0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_10a8;
  size_t local_1068;
  char *pcStack_1060;
  string local_1058 [80];
  string_view local_1008;
  string local_ff8 [48];
  size_t local_fc8;
  char *local_fc0;
  size_t local_fb8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_fb0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_fa8;
  string_view local_f98;
  string local_f88 [80];
  string_view local_f38;
  size_t local_f18;
  char *local_f10;
  size_t local_f08;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_f00;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_ef8;
  size_t local_ed8;
  char *local_ed0;
  size_t local_ec8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_ec0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_eb8;
  string_view local_ea8;
  string local_e98 [80];
  string_view local_e48;
  size_t local_e28;
  char *local_e20;
  size_t local_e18;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_e10;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_e08;
  string_view local_df8;
  string local_de8 [80];
  string_view local_d98;
  size_t local_d78;
  char *local_d70;
  size_t local_d68;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_d60;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_d58;
  size_t local_d48;
  anon_class_8_1_6da50f9a *paStack_d40;
  size_t sStack_d38;
  char *pcStack_d30;
  anon_class_40_5_58554319 *local_d28;
  string_view local_d18;
  string local_d08 [32];
  size_t local_ce8;
  char *pcStack_ce0;
  optional<pbrt::Token> local_cd8;
  string_view local_ca8;
  string local_c98 [32];
  string local_c78 [32];
  string local_c58 [32];
  string local_c38 [48];
  string_view local_c08;
  size_t local_be8;
  char *local_be0;
  undefined8 local_bd8;
  undefined8 local_bd0;
  size_t local_bc8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_bc0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_bb8;
  size_t local_b98;
  char *local_b90;
  undefined8 local_b88;
  undefined8 local_b80;
  size_t local_b78;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_b70;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_b68;
  size_t local_b48;
  char *local_b40;
  undefined8 local_b38;
  undefined8 local_b30;
  size_t local_b28;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_b20;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_b18;
  size_t local_af8;
  char *local_af0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_ae8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_ae0;
  undefined8 local_ad8;
  int local_a9c;
  float local_a98 [4];
  undefined4 local_a88;
  undefined4 local_a84;
  undefined4 local_a80;
  undefined4 local_a7c;
  undefined4 local_a78;
  size_t local_a58;
  char *local_a50;
  undefined8 local_a48;
  undefined8 local_a40;
  size_t local_a38;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_a30;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_a28;
  size_t local_a08;
  char *local_a00;
  size_t local_9f8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_9f0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_9e8;
  size_t local_9d0;
  char *local_9c8;
  string local_998 [32];
  string local_978 [32];
  string_view local_958;
  string local_948 [80];
  size_t local_8f8;
  char *pcStack_8f0;
  size_t sStack_8e8;
  char *pcStack_8e0;
  undefined8 local_8d8;
  size_t local_8b8;
  char *local_8b0;
  undefined8 local_8a8;
  undefined8 local_8a0;
  size_t local_898;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_890;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_888;
  size_t local_868;
  char *local_860;
  undefined8 local_858;
  undefined8 local_850;
  size_t local_848;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_840;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_838;
  size_t local_818;
  char *local_810;
  undefined8 local_808;
  undefined8 local_800;
  size_t local_7f8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_7f0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_7e8;
  size_t local_7c8;
  char *local_7c0;
  size_t local_7b8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_7b0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_7a8;
  string_view local_798;
  string local_788 [80];
  string_view local_738;
  size_t local_718;
  char *local_710;
  size_t local_708;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_700;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_6f8;
  string_view local_6e8;
  string local_6d8 [80];
  string_view local_688;
  size_t local_668;
  char *local_660;
  size_t local_658;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_650;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_648;
  string_view local_638;
  string local_628 [80];
  string_view local_5d8;
  size_t local_5b8;
  char *local_5b0;
  size_t local_5a8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_5a0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_598;
  size_t local_550;
  char *local_548;
  int local_50c;
  float local_508 [32];
  size_t local_488;
  char *local_480;
  size_t local_468;
  char *local_460;
  undefined8 local_458;
  undefined8 local_450;
  size_t local_448;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_440;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_438;
  size_t local_418;
  char *local_410;
  undefined8 local_408;
  undefined8 local_400;
  size_t local_3f8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_3f0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_3e8;
  size_t local_3c8;
  char *local_3c0;
  size_t local_3b8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_3b0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_3a8;
  undefined8 local_388;
  undefined8 local_380;
  size_t local_378;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_370;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_368;
  undefined8 local_348;
  undefined8 local_340;
  size_t local_338;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_330;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_328;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 local_2d0;
  undefined8 local_2c8;
  size_t local_298;
  char *local_290;
  undefined8 local_288;
  undefined8 local_280;
  size_t local_278;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_270;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_268;
  size_t local_248;
  char *local_240;
  size_t local_238;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_230;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_228;
  size_t local_208;
  char *local_200;
  size_t local_1f8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_1f0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_1e8;
  size_t local_1c8;
  char *local_1c0;
  optional<pbrt::Token> *local_188;
  optional<pbrt::Token> local_158;
  undefined1 *local_120;
  optional<pbrt::Token> **local_118;
  polymorphic_allocator<std::byte> *local_110;
  byte *local_108;
  undefined1 *local_100;
  Token **local_f8;
  optional<pbrt::Token> *local_f0;
  optional<pbrt::Token> *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  byte *local_d0;
  Token **local_c8;
  undefined1 local_c0 [39];
  undefined1 local_99;
  optional<pbrt::Token> local_98;
  undefined1 local_68 [40];
  polymorphic_allocator<std::byte> local_40;
  memory_resource local_38 [4];
  byte local_11 [9];
  Token *local_8;
  
  local_8 = in_RDI;
  if (in_RDI == (Token *)0x0) {
    local_1900 = 0;
    uVar1._0_4_ = in_stack_ffffffffffffdf90;
    uVar1._4_4_ = in_stack_ffffffffffffdf94;
  }
  else {
    local_1900 = __dynamic_cast(in_RDI,&SceneRepresentation::typeinfo,&FormattingScene::typeinfo,0);
    uVar1._0_4_ = in_stack_ffffffffffffdf90;
    uVar1._4_4_ = in_stack_ffffffffffffdf94;
  }
  local_11[0] = local_1900 != 0;
  pstd::pmr::get_default_resource();
  TrackedMemoryResource::TrackedMemoryResource
            ((TrackedMemoryResource *)in_stack_ffffffffffffdf80,
             (memory_resource *)CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78));
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator(&local_40,local_38);
  std::
  vector<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
  ::vector((vector<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
            *)0x49b4f6);
  std::
  vector<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
  ::push_back((vector<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
               *)in_stack_ffffffffffffdf80,
              (value_type *)CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78));
  pstd::optional<pbrt::Token>::optional(&local_98);
  std::function<pstd::optional<pbrt::Token>_(int)>::function
            ((function<pstd::optional<pbrt::Token>_(int)> *)in_stack_ffffffffffffdf80);
  local_e0 = local_68;
  local_d0 = local_11;
  local_c8 = &local_8;
  local_e8 = &local_98;
  local_d8 = local_c0;
  std::function<pstd::optional<pbrt::Token>(int)>::operator=
            ((function<pstd::optional<pbrt::Token>_(int)> *)
             CONCAT44(in_stack_ffffffffffffdfa4,in_stack_ffffffffffffdfa0),in_stack_ffffffffffffdf98
            );
  local_f0 = &local_98;
  local_120 = local_c0;
  local_118 = &local_f0;
  local_110 = &local_40;
  local_108 = local_11;
  local_100 = &local_99;
  local_f8 = &local_8;
  pstd::optional<pbrt::Token>::optional(&local_158);
  local_188 = &local_158;
  std::function<std::__cxx11::string()>::
  function<pbrt::parse(pbrt::SceneRepresentation*,std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>)::__2,void>
            ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)CONCAT44(uVar1._4_4_,(undefined4)uVar1),
             (anon_class_8_1_ba1d7cb0 *)in_stack_ffffffffffffdf88);
  CheckCallbackScope::CheckCallbackScope
            ((CheckCallbackScope *)in_stack_ffffffffffffdf80,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78));
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)0x49b66c);
  sVar17._M_str = in_stack_ffffffffffffe2e8;
  sVar17._M_len = in_stack_ffffffffffffe2f0;
  while( true ) {
    std::function<pstd::optional<pbrt::Token>_(int)>::operator()
              ((function<pstd::optional<pbrt::Token>_(int)> *)in_stack_ffffffffffffdf98,uVar1._4_4_)
    ;
    pstd::optional<pbrt::Token>::operator=
              ((optional<pbrt::Token> *)CONCAT44(uVar1._4_4_,(undefined4)uVar1),
               (optional<pbrt::Token> *)in_stack_ffffffffffffdf88);
    pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49b6ab);
    bVar12 = pstd::optional<pbrt::Token>::has_value(&local_158);
    if (!bVar12) break;
    pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49b794);
    pvVar14 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&pTVar13->token,0);
    switch(*pvVar14) {
    case 'A':
      pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49b7ed);
      local_1c8 = (pTVar13->token)._M_len;
      local_1c0 = (pTVar13->token)._M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
      __x._M_str = (char *)in_stack_ffffffffffffdfb0;
      __x._M_len = (size_t)in_stack_ffffffffffffdfa8;
      __y._M_str._0_4_ = in_stack_ffffffffffffdfa0;
      __y._M_len = (size_t)in_stack_ffffffffffffdf98;
      __y._M_str._4_4_ = in_stack_ffffffffffffdfa4;
      bVar12 = std::operator==(__x,__y);
      pTVar13 = local_8;
      if (bVar12) {
        pTVar15 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49b875);
        in_stack_ffffffffffffdf88 =
             *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
               **)&(pTVar15->loc).line;
        local_1f8 = (pTVar15->loc).filename._M_len;
        in_stack_ffffffffffffdf80 =
             (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              *)(pTVar15->loc).filename._M_str;
        in_stack_ffffffffffffdf78 = (undefined4)local_1f8;
        in_stack_ffffffffffffdf7c = (undefined4)(local_1f8 >> 0x20);
        pIStack_1f0 = in_stack_ffffffffffffdf80;
        local_1e8 = in_stack_ffffffffffffdf88;
        (**(code **)((pTVar13->token)._M_len + 0xd8))();
      }
      else {
        pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49b8e5);
        local_208 = (pTVar13->token)._M_len;
        local_200 = (pTVar13->token)._M_str;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
        __x_00._M_str = (char *)in_stack_ffffffffffffdfb0;
        __x_00._M_len = (size_t)in_stack_ffffffffffffdfa8;
        __y_00._M_str._0_4_ = in_stack_ffffffffffffdfa0;
        __y_00._M_len = (size_t)in_stack_ffffffffffffdf98;
        __y_00._M_str._4_4_ = in_stack_ffffffffffffdfa4;
        bVar12 = std::operator==(__x_00,__y_00);
        pTVar13 = local_8;
        if (bVar12) {
          pTVar15 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49b96d);
          in_stack_ffffffffffffdf88 =
               *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                 **)&(pTVar15->loc).line;
          local_238 = (pTVar15->loc).filename._M_len;
          in_stack_ffffffffffffdf80 =
               (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                *)(pTVar15->loc).filename._M_str;
          in_stack_ffffffffffffdf78 = (undefined4)local_238;
          in_stack_ffffffffffffdf7c = (undefined4)(local_238 >> 0x20);
          pIStack_230 = in_stack_ffffffffffffdf80;
          local_228 = in_stack_ffffffffffffdf88;
          (**(code **)((pTVar13->token)._M_len + 0xe0))();
        }
        else {
          pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49b9dd);
          local_248 = (pTVar13->token)._M_len;
          local_240 = (pTVar13->token)._M_str;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
          __x_01._M_str = (char *)in_stack_ffffffffffffdfb0;
          __x_01._M_len = (size_t)in_stack_ffffffffffffdfa8;
          __y_01._M_str._0_4_ = in_stack_ffffffffffffdfa0;
          __y_01._M_len = (size_t)in_stack_ffffffffffffdf98;
          __y_01._M_str._4_4_ = in_stack_ffffffffffffdfa4;
          bVar12 = std::operator==(__x_01,__y_01);
          if (bVar12) {
            pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49ba55);
            in_stack_ffffffffffffdf88 =
                 *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   **)&(pTVar13->loc).line;
            local_278 = (pTVar13->loc).filename._M_len;
            in_stack_ffffffffffffdf80 =
                 (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                  *)(pTVar13->loc).filename._M_str;
            local_280 = 0;
            local_288 = 0xe9;
            in_stack_ffffffffffffdf78 = (undefined4)local_278;
            in_stack_ffffffffffffdf7c = (undefined4)(local_278 >> 0x20);
            loc.filename._M_str = (char *)in_stack_ffffffffffffe1f8;
            loc.filename._M_len = (size_t)in_stack_ffffffffffffe1f0;
            loc._16_8_ = in_stack_ffffffffffffe200;
            pIStack_270 = in_stack_ffffffffffffdf80;
            local_268 = in_stack_ffffffffffffdf88;
            parse::anon_class_48_6_0442aee5::operator()
                      (in_stack_ffffffffffffe1d0,
                       CONCAT44(in_stack_ffffffffffffe1c4,in_stack_ffffffffffffe1c0),loc);
          }
          else {
            pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49bae6);
            local_298 = (pTVar13->token)._M_len;
            local_290 = (pTVar13->token)._M_str;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
            __x_02._M_str = (char *)in_stack_ffffffffffffdfb0;
            __x_02._M_len = (size_t)in_stack_ffffffffffffdfa8;
            __y_02._M_str._0_4_ = in_stack_ffffffffffffdfa0;
            __y_02._M_len = (size_t)in_stack_ffffffffffffdf98;
            __y_02._M_str._4_4_ = in_stack_ffffffffffffdfa4;
            bVar12 = std::operator==(__x_02,__y_02);
            if (bVar12) {
              std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                        ((function<pstd::optional<pbrt::Token>_(int)> *)in_stack_ffffffffffffdf98,
                         uVar1._4_4_);
              pTVar13 = pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49bb7a);
              memcpy(&local_2d0,pTVar13,0x28);
              pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49bbab);
              local_310 = local_2d0;
              local_308 = local_2c8;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
              __x_03._M_str = (char *)in_stack_ffffffffffffdfb0;
              __x_03._M_len = (size_t)in_stack_ffffffffffffdfa8;
              __y_03._M_str._0_4_ = in_stack_ffffffffffffdfa0;
              __y_03._M_len = (size_t)in_stack_ffffffffffffdf98;
              __y_03._M_str._4_4_ = in_stack_ffffffffffffdfa4;
              bVar12 = std::operator==(__x_03,__y_03);
              pTVar13 = local_8;
              if (bVar12) {
                pTVar15 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49bc2a)
                ;
                in_stack_ffffffffffffdf88 =
                     *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                       **)&(pTVar15->loc).line;
                local_338 = (pTVar15->loc).filename._M_len;
                in_stack_ffffffffffffdf80 =
                     (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                      *)(pTVar15->loc).filename._M_str;
                in_stack_ffffffffffffdf78 = (undefined4)local_338;
                in_stack_ffffffffffffdf7c = (undefined4)(local_338 >> 0x20);
                pIStack_330 = in_stack_ffffffffffffdf80;
                local_328 = in_stack_ffffffffffffdf88;
                (**(code **)((pTVar13->token)._M_len + 0x68))();
              }
              else {
                local_348 = local_2d0;
                local_340 = local_2c8;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88
                          );
                __x_04._M_str = (char *)in_stack_ffffffffffffdfb0;
                __x_04._M_len = (size_t)in_stack_ffffffffffffdfa8;
                __y_04._M_str._0_4_ = in_stack_ffffffffffffdfa0;
                __y_04._M_len = (size_t)in_stack_ffffffffffffdf98;
                __y_04._M_str._4_4_ = in_stack_ffffffffffffdfa4;
                bVar12 = std::operator==(__x_04,__y_04);
                pTVar13 = local_8;
                if (bVar12) {
                  pTVar15 = pstd::optional<pbrt::Token>::operator->
                                      ((optional<pbrt::Token> *)0x49bd2c);
                  in_stack_ffffffffffffdf88 =
                       *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                         **)&(pTVar15->loc).line;
                  local_378 = (pTVar15->loc).filename._M_len;
                  in_stack_ffffffffffffdf80 =
                       (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                        *)(pTVar15->loc).filename._M_str;
                  in_stack_ffffffffffffdf78 = (undefined4)local_378;
                  in_stack_ffffffffffffdf7c = (undefined4)(local_378 >> 0x20);
                  pIStack_370 = in_stack_ffffffffffffdf80;
                  local_368 = in_stack_ffffffffffffdf88;
                  (**(code **)((pTVar13->token)._M_len + 0x70))();
                }
                else {
                  local_388 = local_2d0;
                  local_380 = local_2c8;
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             CONCAT44(uVar1._4_4_,(undefined4)uVar1),
                             (char *)in_stack_ffffffffffffdf88);
                  __x_05._M_str = (char *)in_stack_ffffffffffffdfb0;
                  __x_05._M_len = (size_t)in_stack_ffffffffffffdfa8;
                  __y_05._M_str._0_4_ = in_stack_ffffffffffffdfa0;
                  __y_05._M_len = (size_t)in_stack_ffffffffffffdf98;
                  __y_05._M_str._4_4_ = in_stack_ffffffffffffdfa4;
                  bVar12 = std::operator==(__x_05,__y_05);
                  pTVar13 = local_8;
                  if (bVar12) {
                    pTVar15 = pstd::optional<pbrt::Token>::operator->
                                        ((optional<pbrt::Token> *)0x49be08);
                    in_stack_ffffffffffffdf88 =
                         *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                           **)&(pTVar15->loc).line;
                    local_3b8 = (pTVar15->loc).filename._M_len;
                    in_stack_ffffffffffffdf80 =
                         (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                          *)(pTVar15->loc).filename._M_str;
                    in_stack_ffffffffffffdf78 = (undefined4)local_3b8;
                    in_stack_ffffffffffffdf7c = (undefined4)(local_3b8 >> 0x20);
                    pIStack_3b0 = in_stack_ffffffffffffdf80;
                    local_3a8 = in_stack_ffffffffffffdf88;
                    (**(code **)((pTVar13->token)._M_len + 0x78))();
                  }
                  else {
                    pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49be72);
                    parse::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)in_stack_ffffffffffffdfd0,
                               in_stack_ffffffffffffdfc8);
                  }
                }
              }
            }
            else {
              pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49beab);
              local_3c8 = (pTVar13->token)._M_len;
              local_3c0 = (pTVar13->token)._M_str;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
              __x_06._M_str = (char *)in_stack_ffffffffffffdfb0;
              __x_06._M_len = (size_t)in_stack_ffffffffffffdfa8;
              __y_06._M_str._0_4_ = in_stack_ffffffffffffdfa0;
              __y_06._M_len = (size_t)in_stack_ffffffffffffdf98;
              __y_06._M_str._4_4_ = in_stack_ffffffffffffdfa4;
              bVar12 = std::operator==(__x_06,__y_06);
              if (bVar12) {
                pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49bf23)
                ;
                in_stack_ffffffffffffdf88 =
                     *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                       **)&(pTVar13->loc).line;
                local_3f8 = (pTVar13->loc).filename._M_len;
                in_stack_ffffffffffffdf80 =
                     (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                      *)(pTVar13->loc).filename._M_str;
                local_400 = 0;
                local_408 = 0x129;
                in_stack_ffffffffffffdf78 = (undefined4)local_3f8;
                in_stack_ffffffffffffdf7c = (undefined4)(local_3f8 >> 0x20);
                loc_00.filename._M_str = (char *)in_stack_ffffffffffffe1f8;
                loc_00.filename._M_len = (size_t)in_stack_ffffffffffffe1f0;
                loc_00._16_8_ = in_stack_ffffffffffffe200;
                pIStack_3f0 = in_stack_ffffffffffffdf80;
                local_3e8 = in_stack_ffffffffffffdf88;
                parse::anon_class_48_6_0442aee5::operator()
                          (in_stack_ffffffffffffe1d0,
                           CONCAT44(in_stack_ffffffffffffe1c4,in_stack_ffffffffffffe1c0),loc_00);
              }
              else {
                pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49bfb4)
                ;
                local_418 = (pTVar13->token)._M_len;
                local_410 = (pTVar13->token)._M_str;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88
                          );
                __x_07._M_str = (char *)in_stack_ffffffffffffdfb0;
                __x_07._M_len = (size_t)in_stack_ffffffffffffdfa8;
                __y_07._M_str._0_4_ = in_stack_ffffffffffffdfa0;
                __y_07._M_len = (size_t)in_stack_ffffffffffffdf98;
                __y_07._M_str._4_4_ = in_stack_ffffffffffffdfa4;
                bVar12 = std::operator==(__x_07,__y_07);
                if (bVar12) {
                  pTVar13 = pstd::optional<pbrt::Token>::operator->
                                      ((optional<pbrt::Token> *)0x49c02c);
                  in_stack_ffffffffffffdf88 =
                       *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                         **)&(pTVar13->loc).line;
                  local_448 = (pTVar13->loc).filename._M_len;
                  in_stack_ffffffffffffdf80 =
                       (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                        *)(pTVar13->loc).filename._M_str;
                  local_450 = 0;
                  local_458 = 0xa1;
                  in_stack_ffffffffffffdf78 = (undefined4)local_448;
                  in_stack_ffffffffffffdf7c = (undefined4)(local_448 >> 0x20);
                  loc_01.filename._M_str = (char *)in_stack_ffffffffffffe1f8;
                  loc_01.filename._M_len = (size_t)in_stack_ffffffffffffe1f0;
                  loc_01._16_8_ = in_stack_ffffffffffffe200;
                  pIStack_440 = in_stack_ffffffffffffdf80;
                  local_438 = in_stack_ffffffffffffdf88;
                  parse::anon_class_48_6_0442aee5::operator()
                            (in_stack_ffffffffffffe1d0,
                             CONCAT44(in_stack_ffffffffffffe1c4,in_stack_ffffffffffffe1c0),loc_01);
                }
                else {
                  pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49c0ba);
                  parse::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffdfd0,
                             in_stack_ffffffffffffdfc8);
                }
              }
            }
          }
        }
      }
      break;
    default:
      in_stack_ffffffffffffdfa8 =
           (FormattingScene *)
           pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x4a042e);
      parse::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_ffffffffffffdfd0,in_stack_ffffffffffffdfc8);
      break;
    case 'C':
      pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49c0f9);
      local_468 = (pTVar13->token)._M_len;
      local_460 = (pTVar13->token)._M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
      __x_08._M_str = (char *)in_stack_ffffffffffffdfb0;
      __x_08._M_len = (size_t)in_stack_ffffffffffffdfa8;
      __y_08._M_str._0_4_ = in_stack_ffffffffffffdfa0;
      __y_08._M_len = (size_t)in_stack_ffffffffffffdf98;
      __y_08._M_str._4_4_ = in_stack_ffffffffffffdfa4;
      bVar12 = std::operator==(__x_08,__y_08);
      if (bVar12) {
        std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                  ((function<pstd::optional<pbrt::Token>_(int)> *)in_stack_ffffffffffffdf98,
                   uVar1._4_4_);
        pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49c18d);
        local_488 = (pTVar13->token)._M_len;
        local_480 = (pTVar13->token)._M_str;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
        __x_09._M_str = (char *)in_stack_ffffffffffffdfb0;
        __x_09._M_len = (size_t)in_stack_ffffffffffffdfa8;
        __y_09._M_str._0_4_ = in_stack_ffffffffffffdfa0;
        __y_09._M_len = (size_t)in_stack_ffffffffffffdf98;
        __y_09._M_str._4_4_ = in_stack_ffffffffffffdfa4;
        bVar12 = std::operator!=(__x_09,__y_09);
        pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49c203);
        if (bVar12) {
          pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49c21d);
          parse::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)in_stack_ffffffffffffdfd0,in_stack_ffffffffffffdfc8)
          ;
        }
        for (local_50c = 0; local_50c < 0x10; local_50c = local_50c + 1) {
          std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                    ((function<pstd::optional<pbrt::Token>_(int)> *)in_stack_ffffffffffffdf98,
                     uVar1._4_4_);
          pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49c2a8);
          dVar16 = parseNumber((Token *)CONCAT44(in_stack_ffffffffffffe08c,in_stack_ffffffffffffe088
                                                ));
          local_508[local_50c] = (float)dVar16;
          pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49c2f5);
        }
        std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                  ((function<pstd::optional<pbrt::Token>_(int)> *)in_stack_ffffffffffffdf98,
                   uVar1._4_4_);
        pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49c35a);
        local_550 = (pTVar13->token)._M_len;
        local_548 = (pTVar13->token)._M_str;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
        __x_10._M_str = (char *)in_stack_ffffffffffffdfb0;
        __x_10._M_len = (size_t)in_stack_ffffffffffffdfa8;
        __y_10._M_str._0_4_ = in_stack_ffffffffffffdfa0;
        __y_10._M_len = (size_t)in_stack_ffffffffffffdf98;
        __y_10._M_str._4_4_ = in_stack_ffffffffffffdfa4;
        bVar12 = std::operator!=(__x_10,__y_10);
        pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49c3d0);
        if (bVar12) {
          pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49c3ea);
          parse::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)in_stack_ffffffffffffdfd0,in_stack_ffffffffffffdfc8)
          ;
        }
        pTVar13 = local_8;
        pTVar15 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49c460);
        in_stack_ffffffffffffdf88 =
             *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
               **)&(pTVar15->loc).line;
        local_5a8 = (pTVar15->loc).filename._M_len;
        in_stack_ffffffffffffdf80 =
             (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              *)(pTVar15->loc).filename._M_str;
        in_stack_ffffffffffffdf78 = (undefined4)local_5a8;
        in_stack_ffffffffffffdf7c = (undefined4)(local_5a8 >> 0x20);
        pIStack_5a0 = in_stack_ffffffffffffdf80;
        local_598 = in_stack_ffffffffffffdf88;
        (**(code **)((pTVar13->token)._M_len + 0x48))(pTVar13,local_508);
      }
      else {
        pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49c4d5);
        local_5b8 = (pTVar13->token)._M_len;
        local_5b0 = (pTVar13->token)._M_str;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
        __x_11._M_str = (char *)in_stack_ffffffffffffdfb0;
        __x_11._M_len = (size_t)in_stack_ffffffffffffdfa8;
        __y_11._M_str._0_4_ = in_stack_ffffffffffffdfa0;
        __y_11._M_len = (size_t)in_stack_ffffffffffffdf98;
        __y_11._M_str._4_4_ = in_stack_ffffffffffffdfa4;
        bVar12 = std::operator==(__x_11,__y_11);
        if (bVar12) {
          std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                    ((function<pstd::optional<pbrt::Token>_(int)> *)in_stack_ffffffffffffdf98,
                     uVar1._4_4_);
          pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49c569);
          sVar18 = dequoteString(in_stack_ffffffffffffdfe8);
          local_5d8 = sVar18;
          pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49c5bf);
          pTVar13 = local_8;
          s._M_str = (char *)in_stack_ffffffffffffdfc8;
          s._M_len = (size_t)in_stack_ffffffffffffdfc0;
          local_638 = local_5d8;
          toString_abi_cxx11_(s);
          pTVar15 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49c60d);
          in_stack_ffffffffffffdf88 =
               *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                 **)&(pTVar15->loc).line;
          local_658 = (pTVar15->loc).filename._M_len;
          in_stack_ffffffffffffdf80 =
               (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                *)(pTVar15->loc).filename._M_str;
          in_stack_ffffffffffffdf78 = (undefined4)local_658;
          in_stack_ffffffffffffdf7c = (undefined4)(local_658 >> 0x20);
          pIStack_650 = in_stack_ffffffffffffdf80;
          local_648 = in_stack_ffffffffffffdf88;
          (**(code **)((pTVar13->token)._M_len + 0x58))(pTVar13,local_628);
          std::__cxx11::string::~string(local_628);
        }
        else {
          pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49c6db);
          local_668 = (pTVar13->token)._M_len;
          local_660 = (pTVar13->token)._M_str;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
          __x_12._M_str = (char *)in_stack_ffffffffffffdfb0;
          __x_12._M_len = (size_t)in_stack_ffffffffffffdfa8;
          __y_12._M_str._0_4_ = in_stack_ffffffffffffdfa0;
          __y_12._M_len = (size_t)in_stack_ffffffffffffdf98;
          __y_12._M_str._4_4_ = in_stack_ffffffffffffdfa4;
          bVar12 = std::operator==(__x_12,__y_12);
          if (bVar12) {
            std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                      ((function<pstd::optional<pbrt::Token>_(int)> *)in_stack_ffffffffffffdf98,
                       uVar1._4_4_);
            pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49c76f);
            sVar18 = dequoteString(in_stack_ffffffffffffdfe8);
            local_688 = sVar18;
            pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49c7c5);
            pTVar13 = local_8;
            s_00._M_str = (char *)in_stack_ffffffffffffdfc8;
            s_00._M_len = (size_t)in_stack_ffffffffffffdfc0;
            local_6e8 = local_688;
            toString_abi_cxx11_(s_00);
            pTVar15 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49c813);
            in_stack_ffffffffffffdf88 =
                 *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   **)&(pTVar15->loc).line;
            local_708 = (pTVar15->loc).filename._M_len;
            in_stack_ffffffffffffdf80 =
                 (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                  *)(pTVar15->loc).filename._M_str;
            in_stack_ffffffffffffdf78 = (undefined4)local_708;
            in_stack_ffffffffffffdf7c = (undefined4)(local_708 >> 0x20);
            pIStack_700 = in_stack_ffffffffffffdf80;
            local_6f8 = in_stack_ffffffffffffdf88;
            (**(code **)((pTVar13->token)._M_len + 0x60))(pTVar13,local_6d8);
            std::__cxx11::string::~string(local_6d8);
          }
          else {
            pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49c8e1);
            local_718 = (pTVar13->token)._M_len;
            local_710 = (pTVar13->token)._M_str;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
            __x_13._M_str = (char *)in_stack_ffffffffffffdfb0;
            __x_13._M_len = (size_t)in_stack_ffffffffffffdfa8;
            __y_13._M_str._0_4_ = in_stack_ffffffffffffdfa0;
            __y_13._M_len = (size_t)in_stack_ffffffffffffdf98;
            __y_13._M_str._4_4_ = in_stack_ffffffffffffdfa4;
            bVar12 = std::operator==(__x_13,__y_13);
            if (bVar12) {
              std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                        ((function<pstd::optional<pbrt::Token>_(int)> *)in_stack_ffffffffffffdf98,
                         uVar1._4_4_);
              pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49c975);
              sVar18 = dequoteString(in_stack_ffffffffffffdfe8);
              local_738 = sVar18;
              pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49c9cb);
              pTVar13 = local_8;
              s_01._M_str = (char *)in_stack_ffffffffffffdfc8;
              s_01._M_len = (size_t)in_stack_ffffffffffffdfc0;
              local_798 = local_738;
              toString_abi_cxx11_(s_01);
              pTVar15 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49ca19);
              in_stack_ffffffffffffdf88 =
                   *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                     **)&(pTVar15->loc).line;
              local_7b8 = (pTVar15->loc).filename._M_len;
              in_stack_ffffffffffffdf80 =
                   (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                    *)(pTVar15->loc).filename._M_str;
              in_stack_ffffffffffffdf78 = (undefined4)local_7b8;
              in_stack_ffffffffffffdf7c = (undefined4)(local_7b8 >> 0x20);
              pIStack_7b0 = in_stack_ffffffffffffdf80;
              local_7a8 = in_stack_ffffffffffffdf88;
              (**(code **)((pTVar13->token)._M_len + 0x88))(pTVar13,local_788);
              std::__cxx11::string::~string(local_788);
            }
            else {
              pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49caea);
              local_7c8 = (pTVar13->token)._M_len;
              local_7c0 = (pTVar13->token)._M_str;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
              __x_14._M_str = (char *)in_stack_ffffffffffffdfb0;
              __x_14._M_len = (size_t)in_stack_ffffffffffffdfa8;
              __y_14._M_str._0_4_ = in_stack_ffffffffffffdfa0;
              __y_14._M_len = (size_t)in_stack_ffffffffffffdf98;
              __y_14._M_str._4_4_ = in_stack_ffffffffffffdfa4;
              bVar12 = std::operator==(__x_14,__y_14);
              if (bVar12) {
                pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49cb62)
                ;
                in_stack_ffffffffffffdf88 =
                     *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                       **)&(pTVar13->loc).line;
                local_7f8 = (pTVar13->loc).filename._M_len;
                in_stack_ffffffffffffdf80 =
                     (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                      *)(pTVar13->loc).filename._M_str;
                local_800 = 0;
                local_808 = 0xb1;
                in_stack_ffffffffffffdf78 = (undefined4)local_7f8;
                in_stack_ffffffffffffdf7c = (undefined4)(local_7f8 >> 0x20);
                loc_02.filename._M_str = (char *)in_stack_ffffffffffffe1f8;
                loc_02.filename._M_len = (size_t)in_stack_ffffffffffffe1f0;
                loc_02._16_8_ = in_stack_ffffffffffffe200;
                pIStack_7f0 = in_stack_ffffffffffffdf80;
                local_7e8 = in_stack_ffffffffffffdf88;
                parse::anon_class_48_6_0442aee5::operator()
                          (in_stack_ffffffffffffe1d0,
                           CONCAT44(in_stack_ffffffffffffe1c4,in_stack_ffffffffffffe1c0),loc_02);
              }
              else {
                pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49cbf0);
                parse::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)in_stack_ffffffffffffdfd0,
                           in_stack_ffffffffffffdfc8);
              }
            }
          }
        }
      }
      break;
    case 'F':
      pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49cc2d);
      local_818 = (pTVar13->token)._M_len;
      local_810 = (pTVar13->token)._M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
      __x_15._M_str = (char *)in_stack_ffffffffffffdfb0;
      __x_15._M_len = (size_t)in_stack_ffffffffffffdfa8;
      __y_15._M_str._0_4_ = in_stack_ffffffffffffdfa0;
      __y_15._M_len = (size_t)in_stack_ffffffffffffdf98;
      __y_15._M_str._4_4_ = in_stack_ffffffffffffdfa4;
      bVar12 = std::operator==(__x_15,__y_15);
      if (bVar12) {
        pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49cca5);
        in_stack_ffffffffffffdf88 =
             *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
               **)&(pTVar13->loc).line;
        local_848 = (pTVar13->loc).filename._M_len;
        in_stack_ffffffffffffdf80 =
             (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              *)(pTVar13->loc).filename._M_str;
        local_850 = 0;
        local_858 = 0x99;
        in_stack_ffffffffffffdf78 = (undefined4)local_848;
        in_stack_ffffffffffffdf7c = (undefined4)(local_848 >> 0x20);
        loc_03.filename._M_str = (char *)in_stack_ffffffffffffe1f8;
        loc_03.filename._M_len = (size_t)in_stack_ffffffffffffe1f0;
        loc_03._16_8_ = in_stack_ffffffffffffe200;
        pIStack_840 = in_stack_ffffffffffffdf80;
        local_838 = in_stack_ffffffffffffdf88;
        parse::anon_class_48_6_0442aee5::operator()
                  (in_stack_ffffffffffffe1d0,
                   CONCAT44(in_stack_ffffffffffffe1c4,in_stack_ffffffffffffe1c0),loc_03);
      }
      else {
        pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49cd33);
        parse::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)in_stack_ffffffffffffdfd0,in_stack_ffffffffffffdfc8);
      }
      break;
    case 'I':
      pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49cd68);
      local_868 = (pTVar13->token)._M_len;
      local_860 = (pTVar13->token)._M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
      __x_16._M_str = (char *)in_stack_ffffffffffffdfb0;
      __x_16._M_len = (size_t)in_stack_ffffffffffffdfa8;
      __y_16._M_str._0_4_ = in_stack_ffffffffffffdfa0;
      __y_16._M_len = (size_t)in_stack_ffffffffffffdf98;
      __y_16._M_str._4_4_ = in_stack_ffffffffffffdfa4;
      bVar12 = std::operator==(__x_16,__y_16);
      if (bVar12) {
        pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49cde0);
        in_stack_ffffffffffffdf88 =
             *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
               **)&(pTVar13->loc).line;
        local_898 = (pTVar13->loc).filename._M_len;
        in_stack_ffffffffffffdf80 =
             (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              *)(pTVar13->loc).filename._M_str;
        local_8a0 = 0;
        local_8a8 = 0xa9;
        in_stack_ffffffffffffdf78 = (undefined4)local_898;
        in_stack_ffffffffffffdf7c = (undefined4)(local_898 >> 0x20);
        loc_04.filename._M_str = (char *)in_stack_ffffffffffffe1f8;
        loc_04.filename._M_len = (size_t)in_stack_ffffffffffffe1f0;
        loc_04._16_8_ = in_stack_ffffffffffffe200;
        pIStack_890 = in_stack_ffffffffffffdf80;
        local_888 = in_stack_ffffffffffffdf88;
        parse::anon_class_48_6_0442aee5::operator()
                  (in_stack_ffffffffffffe1d0,
                   CONCAT44(in_stack_ffffffffffffe1c4,in_stack_ffffffffffffe1c0),loc_04);
      }
      else {
        pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49ce71);
        local_8b8 = (pTVar13->token)._M_len;
        local_8b0 = (pTVar13->token)._M_str;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
        __x_17._M_str = (char *)in_stack_ffffffffffffdfb0;
        __x_17._M_len = (size_t)in_stack_ffffffffffffdfa8;
        __y_17._M_str._0_4_ = in_stack_ffffffffffffdfa0;
        __y_17._M_len = (size_t)in_stack_ffffffffffffdf98;
        __y_17._M_str._4_4_ = in_stack_ffffffffffffdfa4;
        bVar12 = std::operator==(__x_17,__y_17);
        if (bVar12) {
          std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                    ((function<pstd::optional<pbrt::Token>_(int)> *)in_stack_ffffffffffffdf98,
                     uVar1._4_4_);
          pTVar13 = pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49cf05);
          local_8d8._0_4_ = (pTVar13->loc).line;
          local_8d8._4_4_ = (pTVar13->loc).column;
          local_8f8 = (pTVar13->token)._M_len;
          pcStack_8f0 = (pTVar13->token)._M_str;
          sStack_8e8 = (pTVar13->loc).filename._M_len;
          pcStack_8e0 = (pTVar13->loc).filename._M_str;
          pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49cf40);
          sVar18 = dequoteString(in_stack_ffffffffffffdfe8);
          s_02._M_str = (char *)in_stack_ffffffffffffdfc8;
          s_02._M_len = (size_t)in_stack_ffffffffffffdfc0;
          local_958 = sVar18;
          toString_abi_cxx11_(s_02);
          if ((local_11[0] & 1) == 0) {
            ResolveFilename(in_stack_ffffffffffffe018);
            std::__cxx11::string::operator=(local_948,local_998);
            std::__cxx11::string::~string(local_998);
            std::function<void(char_const*,pbrt::FileLoc_const*)>::
            function<pbrt::parse(pbrt::SceneRepresentation*,std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>)::__3&,void>
                      ((function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)
                       CONCAT44(uVar1._4_4_,(undefined4)uVar1),
                       (anon_class_1_0_00000001 *)in_stack_ffffffffffffdf88);
            Tokenizer::CreateFromFile
                      ((string *)in_stack_ffffffffffffe168,
                       (function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)
                       CONCAT44(in_stack_ffffffffffffe164,in_stack_ffffffffffffe160));
            std::function<void_(const_char_*,_const_pbrt::FileLoc_*)>::~function
                      ((function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)0x49d137);
            bVar12 = std::unique_ptr::operator_cast_to_bool
                               ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>
                                 *)0x49d144);
            if (bVar12) {
              std::
              vector<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
              ::push_back((vector<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
                           *)in_stack_ffffffffffffdf80,
                          (value_type *)
                          CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78));
            }
            std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
                      ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
                       in_stack_ffffffffffffdf80);
          }
          else {
            if (local_8 != (Token *)0x0) {
              __dynamic_cast(local_8,&SceneRepresentation::typeinfo,&FormattingScene::typeinfo,0);
            }
            FormattingScene::indent_abi_cxx11_(in_stack_ffffffffffffdfa8,in_stack_ffffffffffffdfa4);
            Printf<std::__cxx11::string,std::__cxx11::string&>
                      ((char *)in_stack_ffffffffffffdfc0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffdfb8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffdfb0);
            std::__cxx11::string::~string(local_978);
          }
          std::__cxx11::string::~string(local_948);
        }
        else {
          pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49d1e7);
          local_9d0 = (pTVar13->token)._M_len;
          local_9c8 = (pTVar13->token)._M_str;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
          __x_18._M_str = (char *)in_stack_ffffffffffffdfb0;
          __x_18._M_len = (size_t)in_stack_ffffffffffffdfa8;
          __y_18._M_str._0_4_ = in_stack_ffffffffffffdfa0;
          __y_18._M_len = (size_t)in_stack_ffffffffffffdf98;
          __y_18._M_str._4_4_ = in_stack_ffffffffffffdfa4;
          bVar12 = std::operator==(__x_18,__y_18);
          pTVar13 = local_8;
          if (bVar12) {
            pTVar15 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49d26c);
            in_stack_ffffffffffffdf88 =
                 *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   **)&(pTVar15->loc).line;
            local_9f8 = (pTVar15->loc).filename._M_len;
            in_stack_ffffffffffffdf80 =
                 (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                  *)(pTVar15->loc).filename._M_str;
            in_stack_ffffffffffffdf78 = (undefined4)local_9f8;
            in_stack_ffffffffffffdf7c = (undefined4)(local_9f8 >> 0x20);
            pIStack_9f0 = in_stack_ffffffffffffdf80;
            local_9e8 = in_stack_ffffffffffffdf88;
            (**(code **)((pTVar13->token)._M_len + 0x28))();
          }
          else {
            pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49d2d6);
            parse::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)in_stack_ffffffffffffdfd0,
                       in_stack_ffffffffffffdfc8);
          }
        }
      }
      break;
    case 'L':
      pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49d30f);
      local_a08 = (pTVar13->token)._M_len;
      local_a00 = (pTVar13->token)._M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
      __x_19._M_str = (char *)in_stack_ffffffffffffdfb0;
      __x_19._M_len = (size_t)in_stack_ffffffffffffdfa8;
      __y_19._M_str._0_4_ = in_stack_ffffffffffffdfa0;
      __y_19._M_len = (size_t)in_stack_ffffffffffffdf98;
      __y_19._M_str._4_4_ = in_stack_ffffffffffffdfa4;
      bVar12 = std::operator==(__x_19,__y_19);
      if (bVar12) {
        pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49d387);
        in_stack_ffffffffffffdf88 =
             *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
               **)&(pTVar13->loc).line;
        local_a38 = (pTVar13->loc).filename._M_len;
        in_stack_ffffffffffffdf80 =
             (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              *)(pTVar13->loc).filename._M_str;
        local_a40 = 0;
        local_a48 = 0x121;
        in_stack_ffffffffffffdf78 = (undefined4)local_a38;
        in_stack_ffffffffffffdf7c = (undefined4)(local_a38 >> 0x20);
        loc_05.filename._M_str = (char *)in_stack_ffffffffffffe1f8;
        loc_05.filename._M_len = (size_t)in_stack_ffffffffffffe1f0;
        loc_05._16_8_ = in_stack_ffffffffffffe200;
        pIStack_a30 = in_stack_ffffffffffffdf80;
        local_a28 = in_stack_ffffffffffffdf88;
        parse::anon_class_48_6_0442aee5::operator()
                  (in_stack_ffffffffffffe1d0,
                   CONCAT44(in_stack_ffffffffffffe1c4,in_stack_ffffffffffffe1c0),loc_05);
      }
      else {
        pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49d418);
        local_a58 = (pTVar13->token)._M_len;
        local_a50 = (pTVar13->token)._M_str;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
        __x_20._M_str = (char *)in_stack_ffffffffffffdfb0;
        __x_20._M_len = (size_t)in_stack_ffffffffffffdfa8;
        __y_20._M_str._0_4_ = in_stack_ffffffffffffdfa0;
        __y_20._M_len = (size_t)in_stack_ffffffffffffdf98;
        __y_20._M_str._4_4_ = in_stack_ffffffffffffdfa4;
        bVar12 = std::operator==(__x_20,__y_20);
        if (bVar12) {
          for (local_a9c = 0; pTVar13 = local_8, in_stack_ffffffffffffdf78 = local_a78,
              uVar11 = local_a7c, uVar10 = local_a80, uVar9 = local_a84, uVar8 = local_a88,
              fVar7 = local_a98[3], fVar6 = local_a98[2], fVar5 = local_a98[1], fVar4 = local_a98[0]
              , local_a9c < 9; local_a9c = local_a9c + 1) {
            std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                      ((function<pstd::optional<pbrt::Token>_(int)> *)in_stack_ffffffffffffdf98,
                       uVar1._4_4_);
            pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49d4c5);
            dVar16 = parseNumber((Token *)CONCAT44(in_stack_ffffffffffffe08c,
                                                   in_stack_ffffffffffffe088));
            local_a98[local_a9c] = (float)dVar16;
            pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49d512);
          }
          pTVar15 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49d60d);
          uVar1._0_4_ = (pTVar15->loc).line;
          uVar1._4_4_ = (pTVar15->loc).column;
          in_stack_ffffffffffffdf80 =
               (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                *)(pTVar15->loc).filename._M_len;
          in_stack_ffffffffffffdf88 =
               (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                *)(pTVar15->loc).filename._M_str;
          local_ae8 = in_stack_ffffffffffffdf80;
          pIStack_ae0 = in_stack_ffffffffffffdf88;
          local_ad8 = uVar1;
          (**(code **)((pTVar13->token)._M_len + 0x40))
                    (fVar4,fVar5,fVar6,fVar7,uVar8,uVar9,uVar10,uVar11);
        }
        else {
          pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49d6cd);
          parse::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)in_stack_ffffffffffffdfd0,in_stack_ffffffffffffdfc8)
          ;
        }
      }
      break;
    case 'M':
      pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49d704);
      local_af8 = (pTVar13->token)._M_len;
      local_af0 = (pTVar13->token)._M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
      __x_21._M_str = (char *)in_stack_ffffffffffffdfb0;
      __x_21._M_len = (size_t)in_stack_ffffffffffffdfa8;
      __y_21._M_str._0_4_ = in_stack_ffffffffffffdfa0;
      __y_21._M_len = (size_t)in_stack_ffffffffffffdf98;
      __y_21._M_str._4_4_ = in_stack_ffffffffffffdfa4;
      bVar12 = std::operator==(__x_21,__y_21);
      if (bVar12) {
        pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49d77c);
        in_stack_ffffffffffffdf88 =
             *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
               **)&(pTVar13->loc).line;
        local_b28 = (pTVar13->loc).filename._M_len;
        in_stack_ffffffffffffdf80 =
             (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              *)(pTVar13->loc).filename._M_str;
        local_b30 = 0;
        local_b38 = 0x111;
        in_stack_ffffffffffffdf78 = (undefined4)local_b28;
        in_stack_ffffffffffffdf7c = (undefined4)(local_b28 >> 0x20);
        loc_06.filename._M_str = (char *)in_stack_ffffffffffffe1f8;
        loc_06.filename._M_len = (size_t)in_stack_ffffffffffffe1f0;
        loc_06._16_8_ = in_stack_ffffffffffffe200;
        pIStack_b20 = in_stack_ffffffffffffdf80;
        local_b18 = in_stack_ffffffffffffdf88;
        parse::anon_class_48_6_0442aee5::operator()
                  (in_stack_ffffffffffffe1d0,
                   CONCAT44(in_stack_ffffffffffffe1c4,in_stack_ffffffffffffe1c0),loc_06);
      }
      else {
        pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49d80d);
        local_b48 = (pTVar13->token)._M_len;
        local_b40 = (pTVar13->token)._M_str;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
        __x_22._M_str = (char *)in_stack_ffffffffffffdfb0;
        __x_22._M_len = (size_t)in_stack_ffffffffffffdfa8;
        __y_22._M_str._0_4_ = in_stack_ffffffffffffdfa0;
        __y_22._M_len = (size_t)in_stack_ffffffffffffdf98;
        __y_22._M_str._4_4_ = in_stack_ffffffffffffdfa4;
        bVar12 = std::operator==(__x_22,__y_22);
        if (bVar12) {
          pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49d885);
          in_stack_ffffffffffffdf88 =
               *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                 **)&(pTVar13->loc).line;
          local_b78 = (pTVar13->loc).filename._M_len;
          in_stack_ffffffffffffdf80 =
               (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                *)(pTVar13->loc).filename._M_str;
          local_b80 = 0;
          local_b88 = 0xb9;
          in_stack_ffffffffffffdf78 = (undefined4)local_b78;
          in_stack_ffffffffffffdf7c = (undefined4)(local_b78 >> 0x20);
          loc_07.filename._M_str = (char *)in_stack_ffffffffffffe1f8;
          loc_07.filename._M_len = (size_t)in_stack_ffffffffffffe1f0;
          loc_07._16_8_ = in_stack_ffffffffffffe200;
          pIStack_b70 = in_stack_ffffffffffffdf80;
          local_b68 = in_stack_ffffffffffffdf88;
          parse::anon_class_48_6_0442aee5::operator()
                    (in_stack_ffffffffffffe1d0,
                     CONCAT44(in_stack_ffffffffffffe1c4,in_stack_ffffffffffffe1c0),loc_07);
        }
        else {
          pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49d916);
          local_b98 = (pTVar13->token)._M_len;
          local_b90 = (pTVar13->token)._M_str;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
          __x_23._M_str = (char *)in_stack_ffffffffffffdfb0;
          __x_23._M_len = (size_t)in_stack_ffffffffffffdfa8;
          __y_23._M_str._0_4_ = in_stack_ffffffffffffdfa0;
          __y_23._M_len = (size_t)in_stack_ffffffffffffdf98;
          __y_23._M_str._4_4_ = in_stack_ffffffffffffdfa4;
          bVar12 = std::operator==(__x_23,__y_23);
          if (bVar12) {
            pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49d98e);
            in_stack_ffffffffffffdf88 =
                 *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   **)&(pTVar13->loc).line;
            local_bc8 = (pTVar13->loc).filename._M_len;
            in_stack_ffffffffffffdf80 =
                 (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                  *)(pTVar13->loc).filename._M_str;
            local_bd0 = 0;
            local_bd8 = 0x109;
            in_stack_ffffffffffffdf78 = (undefined4)local_bc8;
            in_stack_ffffffffffffdf7c = (undefined4)(local_bc8 >> 0x20);
            loc_08.filename._M_str = (char *)in_stack_ffffffffffffe1f8;
            loc_08.filename._M_len = (size_t)in_stack_ffffffffffffe1f0;
            loc_08._16_8_ = in_stack_ffffffffffffe200;
            pIStack_bc0 = in_stack_ffffffffffffdf80;
            local_bb8 = in_stack_ffffffffffffdf88;
            parse::anon_class_48_6_0442aee5::operator()
                      (in_stack_ffffffffffffe1d0,
                       CONCAT44(in_stack_ffffffffffffe1c4,in_stack_ffffffffffffe1c0),loc_08);
          }
          else {
            pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49da1f);
            local_be8 = (pTVar13->token)._M_len;
            local_be0 = (pTVar13->token)._M_str;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
            __x_24._M_str = (char *)in_stack_ffffffffffffdfb0;
            __x_24._M_len = (size_t)in_stack_ffffffffffffdfa8;
            __y_24._M_str._0_4_ = in_stack_ffffffffffffdfa0;
            __y_24._M_len = (size_t)in_stack_ffffffffffffdf98;
            __y_24._M_str._4_4_ = in_stack_ffffffffffffdfa4;
            bVar12 = std::operator==(__x_24,__y_24);
            if (bVar12) {
              std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                        ((function<pstd::optional<pbrt::Token>_(int)> *)in_stack_ffffffffffffdf98,
                         uVar1._4_4_);
              pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49dab3);
              sVar18 = dequoteString(in_stack_ffffffffffffdfe8);
              local_c08 = sVar18;
              pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49db09);
              local_1c50 = local_c78;
              do {
                std::__cxx11::string::string(local_1c50);
                local_1c50 = local_1c50 + 0x20;
              } while (local_1c50 != local_c38);
              s_03._M_str = (char *)in_stack_ffffffffffffdfc8;
              s_03._M_len = (size_t)in_stack_ffffffffffffdfc0;
              local_ca8 = local_c08;
              toString_abi_cxx11_(s_03);
              std::__cxx11::string::operator=(local_c78,local_c98);
              std::__cxx11::string::~string(local_c98);
              std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                        ((function<pstd::optional<pbrt::Token>_(int)> *)in_stack_ffffffffffffdf98,
                         uVar1._4_4_);
              bVar12 = pstd::optional<pbrt::Token>::has_value(&local_cd8);
              if (bVar12) {
                pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49dc05)
                ;
                local_ce8 = (pTVar13->token)._M_len;
                pcStack_ce0 = (pTVar13->token)._M_str;
                str._M_len._4_4_ = in_stack_ffffffffffffdf7c;
                str._M_len._0_4_ = in_stack_ffffffffffffdf78;
                str._M_str = (char *)in_stack_ffffffffffffdf80;
                bVar12 = isQuotedString(str);
                if (bVar12) {
                  pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49dc5f);
                  sVar18 = dequoteString(in_stack_ffffffffffffdfe8);
                  s_04._M_str = (char *)in_stack_ffffffffffffdfc8;
                  s_04._M_len = (size_t)in_stack_ffffffffffffdfc0;
                  local_d18 = sVar18;
                  toString_abi_cxx11_(s_04);
                  std::__cxx11::string::operator=(local_c58,local_d08);
                  std::__cxx11::string::~string(local_d08);
                }
                else {
                  pTVar13 = pstd::optional<pbrt::Token>::operator*
                                      ((optional<pbrt::Token> *)0x49dd64);
                  in_stack_ffffffffffffdf98 = *(anon_class_40_5_58554319 **)&(pTVar13->loc).line;
                  local_d48 = (pTVar13->token)._M_len;
                  paStack_d40 = (anon_class_8_1_6da50f9a *)(pTVar13->token)._M_str;
                  sStack_d38 = (pTVar13->loc).filename._M_len;
                  ppcVar3 = &(pTVar13->loc).filename._M_str;
                  pcStack_d30 = *ppcVar3;
                  uVar1._0_4_ = SUB84(pcStack_d30,0);
                  uVar1._4_4_ = (int)((ulong)pcStack_d30 >> 0x20);
                  t_00.loc.filename._M_len._0_4_ = in_stack_ffffffffffffdfa0;
                  t_00.token = (string_view)*(undefined1 (*) [16])ppcVar3;
                  t_00.loc.filename._M_len._4_4_ = in_stack_ffffffffffffdfa4;
                  t_00.loc.filename._M_str = (char *)in_stack_ffffffffffffdfa8;
                  t_00.loc._16_8_ = in_stack_ffffffffffffdfb0;
                  local_d28 = in_stack_ffffffffffffdf98;
                  parse::anon_class_8_1_6da50f9a::operator()(paStack_d40,t_00);
                  std::__cxx11::string::operator=(local_c58,local_c78);
                }
              }
              else {
                std::__cxx11::string::operator=(local_c58,local_c78);
              }
              pTVar13 = local_8;
              pTVar15 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49de2e);
              in_stack_ffffffffffffdf88 =
                   *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                     **)&(pTVar15->loc).line;
              local_d68 = (pTVar15->loc).filename._M_len;
              in_stack_ffffffffffffdf80 =
                   (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                    *)(pTVar15->loc).filename._M_str;
              in_stack_ffffffffffffdf78 = (undefined4)local_d68;
              in_stack_ffffffffffffdf7c = (undefined4)(local_d68 >> 0x20);
              pIStack_d60 = in_stack_ffffffffffffdf80;
              local_d58 = in_stack_ffffffffffffdf88;
              (**(code **)((pTVar13->token)._M_len + 0xc0))(pTVar13,local_c78,local_c58);
              pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49dea9);
              local_1cc8 = local_c38;
              do {
                local_1cc8 = local_1cc8 + -0x20;
                std::__cxx11::string::~string(local_1cc8);
              } while (local_1cc8 != local_c78);
            }
            else {
              in_stack_ffffffffffffe308.ungetToken =
                   (optional<pbrt::Token> *)
                   pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49df64);
              parse::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)in_stack_ffffffffffffdfd0,
                         in_stack_ffffffffffffdfc8);
            }
          }
        }
      }
      break;
    case 'N':
      in_stack_ffffffffffffe300.memoryResource =
           (memory_resource *)
           pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49df9f);
      local_d78 = (((Token *)in_stack_ffffffffffffe300.memoryResource)->token)._M_len;
      local_d70 = (((Token *)in_stack_ffffffffffffe300.memoryResource)->token)._M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
      __x_25._M_str = (char *)in_stack_ffffffffffffdfb0;
      __x_25._M_len = (size_t)in_stack_ffffffffffffdfa8;
      __y_25._M_str._0_4_ = in_stack_ffffffffffffdfa0;
      __y_25._M_len = (size_t)in_stack_ffffffffffffdf98;
      __y_25._M_str._4_4_ = in_stack_ffffffffffffdfa4;
      bVar12 = std::operator==(__x_25,__y_25);
      if (bVar12) {
        std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                  ((function<pstd::optional<pbrt::Token>_(int)> *)in_stack_ffffffffffffdf98,
                   uVar1._4_4_);
        in_stack_ffffffffffffe2f8 =
             pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49e033);
        sVar17 = dequoteString(in_stack_ffffffffffffdfe8);
        local_d98 = sVar17;
        pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49e089);
        pTVar13 = local_8;
        s_05._M_str = (char *)in_stack_ffffffffffffdfc8;
        s_05._M_len = (size_t)in_stack_ffffffffffffdfc0;
        local_df8 = local_d98;
        toString_abi_cxx11_(s_05);
        pTVar15 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49e0d7);
        in_stack_ffffffffffffdf88 =
             *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
               **)&(pTVar15->loc).line;
        local_e18 = (pTVar15->loc).filename._M_len;
        in_stack_ffffffffffffdf80 =
             (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              *)(pTVar15->loc).filename._M_str;
        in_stack_ffffffffffffdf78 = (undefined4)local_e18;
        in_stack_ffffffffffffdf7c = (undefined4)(local_e18 >> 0x20);
        pIStack_e10 = in_stack_ffffffffffffdf80;
        local_e08 = in_stack_ffffffffffffdf88;
        (**(code **)((pTVar13->token)._M_len + 0x118))(pTVar13,local_de8);
        std::__cxx11::string::~string(local_de8);
      }
      else {
        pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49e1a5);
        parse::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)in_stack_ffffffffffffdfd0,in_stack_ffffffffffffdfc8);
      }
      break;
    case 'O':
      pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49e1da);
      local_e28 = (pTVar13->token)._M_len;
      local_e20 = (pTVar13->token)._M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
      __x_26._M_str = (char *)in_stack_ffffffffffffdfb0;
      __x_26._M_len = (size_t)in_stack_ffffffffffffdfa8;
      __y_26._M_str._0_4_ = in_stack_ffffffffffffdfa0;
      __y_26._M_len = (size_t)in_stack_ffffffffffffdf98;
      __y_26._M_str._4_4_ = in_stack_ffffffffffffdfa4;
      bVar12 = std::operator==(__x_26,__y_26);
      if (bVar12) {
        std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                  ((function<pstd::optional<pbrt::Token>_(int)> *)in_stack_ffffffffffffdf98,
                   uVar1._4_4_);
        pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49e26e);
        sVar18 = dequoteString(in_stack_ffffffffffffdfe8);
        local_e48 = sVar18;
        pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49e2c4);
        pTVar13 = local_8;
        s_06._M_str = (char *)in_stack_ffffffffffffdfc8;
        s_06._M_len = (size_t)in_stack_ffffffffffffdfc0;
        local_ea8 = local_e48;
        toString_abi_cxx11_(s_06);
        pTVar15 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49e312);
        in_stack_ffffffffffffdf88 =
             *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
               **)&(pTVar15->loc).line;
        local_ec8 = (pTVar15->loc).filename._M_len;
        in_stack_ffffffffffffdf80 =
             (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              *)(pTVar15->loc).filename._M_str;
        in_stack_ffffffffffffdf78 = (undefined4)local_ec8;
        in_stack_ffffffffffffdf7c = (undefined4)(local_ec8 >> 0x20);
        pIStack_ec0 = in_stack_ffffffffffffdf80;
        local_eb8 = in_stack_ffffffffffffdf88;
        (**(code **)((pTVar13->token)._M_len + 0x138))(pTVar13,local_e98);
        std::__cxx11::string::~string(local_e98);
      }
      else {
        pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49e3e3);
        local_ed8 = (pTVar13->token)._M_len;
        local_ed0 = (pTVar13->token)._M_str;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
        __x_27._M_str = (char *)in_stack_ffffffffffffdfb0;
        __x_27._M_len = (size_t)in_stack_ffffffffffffdfa8;
        __y_27._M_str._0_4_ = in_stack_ffffffffffffdfa0;
        __y_27._M_len = (size_t)in_stack_ffffffffffffdf98;
        __y_27._M_str._4_4_ = in_stack_ffffffffffffdfa4;
        bVar12 = std::operator==(__x_27,__y_27);
        pTVar13 = local_8;
        if (bVar12) {
          pTVar15 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49e46b);
          in_stack_ffffffffffffdf88 =
               *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                 **)&(pTVar15->loc).line;
          local_f08 = (pTVar15->loc).filename._M_len;
          in_stack_ffffffffffffdf80 =
               (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                *)(pTVar15->loc).filename._M_str;
          in_stack_ffffffffffffdf78 = (undefined4)local_f08;
          in_stack_ffffffffffffdf7c = (undefined4)(local_f08 >> 0x20);
          pIStack_f00 = in_stack_ffffffffffffdf80;
          local_ef8 = in_stack_ffffffffffffdf88;
          (**(code **)((pTVar13->token)._M_len + 0x140))();
        }
        else {
          pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49e4db);
          local_f18 = (pTVar13->token)._M_len;
          local_f10 = (pTVar13->token)._M_str;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
          __x_28._M_str = (char *)in_stack_ffffffffffffdfb0;
          __x_28._M_len = (size_t)in_stack_ffffffffffffdfa8;
          __y_28._M_str._0_4_ = in_stack_ffffffffffffdfa0;
          __y_28._M_len = (size_t)in_stack_ffffffffffffdf98;
          __y_28._M_str._4_4_ = in_stack_ffffffffffffdfa4;
          bVar12 = std::operator==(__x_28,__y_28);
          if (bVar12) {
            std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                      ((function<pstd::optional<pbrt::Token>_(int)> *)in_stack_ffffffffffffdf98,
                       uVar1._4_4_);
            pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49e56f);
            sVar18 = dequoteString(in_stack_ffffffffffffdfe8);
            local_f38 = sVar18;
            pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49e5c5);
            pTVar13 = local_8;
            s_07._M_str = (char *)in_stack_ffffffffffffdfc8;
            s_07._M_len = (size_t)in_stack_ffffffffffffdfc0;
            local_f98 = local_f38;
            toString_abi_cxx11_(s_07);
            pTVar15 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49e613);
            in_stack_ffffffffffffdf88 =
                 *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   **)&(pTVar15->loc).line;
            local_fb8 = (pTVar15->loc).filename._M_len;
            in_stack_ffffffffffffdf80 =
                 (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                  *)(pTVar15->loc).filename._M_str;
            in_stack_ffffffffffffdf78 = (undefined4)local_fb8;
            in_stack_ffffffffffffdf7c = (undefined4)(local_fb8 >> 0x20);
            pIStack_fb0 = in_stack_ffffffffffffdf80;
            local_fa8 = in_stack_ffffffffffffdf88;
            (**(code **)((pTVar13->token)._M_len + 0x148))(pTVar13,local_f88);
            std::__cxx11::string::~string(local_f88);
          }
          else {
            pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49e6e4);
            local_fc8 = (pTVar13->token)._M_len;
            local_fc0 = (pTVar13->token)._M_str;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
            __x_29._M_str = (char *)in_stack_ffffffffffffdfb0;
            __x_29._M_len = (size_t)in_stack_ffffffffffffdfa8;
            __y_29._M_str._0_4_ = in_stack_ffffffffffffdfa0;
            __y_29._M_len = (size_t)in_stack_ffffffffffffdf98;
            __y_29._M_str._4_4_ = in_stack_ffffffffffffdfa4;
            bVar12 = std::operator==(__x_29,__y_29);
            if (bVar12) {
              std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                        ((function<pstd::optional<pbrt::Token>_(int)> *)in_stack_ffffffffffffdf98,
                         uVar1._4_4_);
              pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49e778);
              sVar18 = dequoteString(in_stack_ffffffffffffdfe8);
              s_08._M_str = (char *)in_stack_ffffffffffffdfc8;
              s_08._M_len = (size_t)in_stack_ffffffffffffdfc0;
              local_1008 = sVar18;
              toString_abi_cxx11_(s_08);
              pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49e7ed);
              std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                        ((function<pstd::optional<pbrt::Token>_(int)> *)in_stack_ffffffffffffdf98,
                         uVar1._4_4_);
              pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49e816);
              local_1068 = (pTVar13->token)._M_len;
              pcStack_1060 = (pTVar13->token)._M_str;
              s_09._M_str = (char *)in_stack_ffffffffffffdfc8;
              s_09._M_len = (size_t)in_stack_ffffffffffffdfc0;
              toString_abi_cxx11_(s_09);
              pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49e861);
              pTVar13 = local_8;
              pTVar15 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49e87e);
              in_stack_ffffffffffffdf88 =
                   *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                     **)&(pTVar15->loc).line;
              local_10b8 = (pTVar15->loc).filename._M_len;
              in_stack_ffffffffffffdf80 =
                   (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                    *)(pTVar15->loc).filename._M_str;
              in_stack_ffffffffffffdf78 = (undefined4)local_10b8;
              in_stack_ffffffffffffdf7c = (undefined4)(local_10b8 >> 0x20);
              pIStack_10b0 = in_stack_ffffffffffffdf80;
              local_10a8 = in_stack_ffffffffffffdf88;
              (**(code **)((pTVar13->token)._M_len + 0x20))(pTVar13,local_ff8,local_1058);
              std::__cxx11::string::~string(local_1058);
              std::__cxx11::string::~string(local_ff8);
            }
            else {
              pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49e9a7);
              parse::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)in_stack_ffffffffffffdfd0,
                         in_stack_ffffffffffffdfc8);
            }
          }
        }
      }
      break;
    case 'P':
      pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49e9e2);
      local_10c8 = (pTVar13->token)._M_len;
      local_10c0 = (pTVar13->token)._M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
      __x_30._M_str = (char *)in_stack_ffffffffffffdfb0;
      __x_30._M_len = (size_t)in_stack_ffffffffffffdfa8;
      __y_30._M_str._0_4_ = in_stack_ffffffffffffdfa0;
      __y_30._M_len = (size_t)in_stack_ffffffffffffdf98;
      __y_30._M_str._4_4_ = in_stack_ffffffffffffdfa4;
      bVar12 = std::operator==(__x_30,__y_30);
      if (bVar12) {
        pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49ea5a);
        in_stack_ffffffffffffdf88 =
             *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
               **)&(pTVar13->loc).line;
        local_10f8 = (pTVar13->loc).filename._M_len;
        in_stack_ffffffffffffdf80 =
             (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              *)(pTVar13->loc).filename._M_str;
        local_1100 = 0;
        local_1108 = 0x91;
        in_stack_ffffffffffffdf78 = (undefined4)local_10f8;
        in_stack_ffffffffffffdf7c = (undefined4)(local_10f8 >> 0x20);
        loc_09.filename._M_str = (char *)in_stack_ffffffffffffe1f8;
        loc_09.filename._M_len = (size_t)in_stack_ffffffffffffe1f0;
        loc_09._16_8_ = in_stack_ffffffffffffe200;
        pIStack_10f0 = in_stack_ffffffffffffdf80;
        local_10e8 = in_stack_ffffffffffffdf88;
        parse::anon_class_48_6_0442aee5::operator()
                  (in_stack_ffffffffffffe1d0,
                   CONCAT44(in_stack_ffffffffffffe1c4,in_stack_ffffffffffffe1c0),loc_09);
      }
      else {
        in_stack_ffffffffffffe200 =
             pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49eae8);
        parse::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)in_stack_ffffffffffffdfd0,in_stack_ffffffffffffdfc8);
      }
      break;
    case 'R':
      in_stack_ffffffffffffe1f8 =
           pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49eb1d);
      local_1118 = (in_stack_ffffffffffffe1f8->token)._M_len;
      local_1110 = (in_stack_ffffffffffffe1f8->token)._M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
      __x_31._M_str = (char *)in_stack_ffffffffffffdfb0;
      __x_31._M_len = (size_t)in_stack_ffffffffffffdfa8;
      __y_31._M_str._0_4_ = in_stack_ffffffffffffdfa0;
      __y_31._M_len = (size_t)in_stack_ffffffffffffdf98;
      __y_31._M_str._4_4_ = in_stack_ffffffffffffdfa4;
      bVar12 = std::operator==(__x_31,__y_31);
      pTVar13 = local_8;
      if (bVar12) {
        in_stack_ffffffffffffe1f0 =
             pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49eba5);
        in_stack_ffffffffffffdf88 =
             *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
               **)&(in_stack_ffffffffffffe1f0->loc).line;
        local_1148 = (in_stack_ffffffffffffe1f0->loc).filename._M_len;
        in_stack_ffffffffffffdf80 =
             (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              *)(in_stack_ffffffffffffe1f0->loc).filename._M_str;
        in_stack_ffffffffffffdf78 = (undefined4)local_1148;
        in_stack_ffffffffffffdf7c = (undefined4)(local_1148 >> 0x20);
        pIStack_1140 = in_stack_ffffffffffffdf80;
        local_1138 = in_stack_ffffffffffffdf88;
        (**(code **)((pTVar13->token)._M_len + 0x130))();
      }
      else {
        pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49ec15);
        local_1158 = (pTVar13->token)._M_len;
        local_1150 = (pTVar13->token)._M_str;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
        __x_32._M_str = (char *)in_stack_ffffffffffffdfb0;
        __x_32._M_len = (size_t)in_stack_ffffffffffffdfa8;
        __y_32._M_str._0_4_ = in_stack_ffffffffffffdfa0;
        __y_32._M_len = (size_t)in_stack_ffffffffffffdf98;
        __y_32._M_str._4_4_ = in_stack_ffffffffffffdfa4;
        bVar12 = std::operator==(__x_32,__y_32);
        if (bVar12) {
          for (local_117c = 0; pTVar13 = local_8, fVar5 = local_1178[1], fVar4 = local_1178[0],
              local_117c < 4; local_117c = local_117c + 1) {
            std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                      ((function<pstd::optional<pbrt::Token>_(int)> *)in_stack_ffffffffffffdf98,
                       uVar1._4_4_);
            pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49ecc2);
            in_stack_ffffffffffffe1d0 =
                 (anon_class_48_6_0442aee5 *)
                 parseNumber((Token *)CONCAT44(in_stack_ffffffffffffe08c,in_stack_ffffffffffffe088))
            ;
            local_1178[local_117c] = (float)(double)in_stack_ffffffffffffe1d0;
            pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49ed0f);
          }
          in_stack_ffffffffffffe1c0 = local_1178[2];
          in_stack_ffffffffffffe1c4 = local_1178[3];
          pTVar15 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49edb0);
          in_stack_ffffffffffffdf88 =
               *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                 **)&(pTVar15->loc).line;
          local_11c8 = (pTVar15->loc).filename._M_len;
          in_stack_ffffffffffffdf80 =
               (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                *)(pTVar15->loc).filename._M_str;
          in_stack_ffffffffffffdf78 = (undefined4)local_11c8;
          in_stack_ffffffffffffdf7c = (undefined4)(local_11c8 >> 0x20);
          pIStack_11c0 = in_stack_ffffffffffffdf80;
          local_11b8 = in_stack_ffffffffffffdf88;
          (**(code **)((pTVar13->token)._M_len + 0x38))
                    (fVar4,fVar5,in_stack_ffffffffffffe1c0,in_stack_ffffffffffffe1c4);
        }
        else {
          pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49ee3e);
          parse::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)in_stack_ffffffffffffdfd0,in_stack_ffffffffffffdfc8)
          ;
        }
      }
      break;
    case 'S':
      pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49ee75);
      local_11d8 = (pTVar13->token)._M_len;
      local_11d0 = (pTVar13->token)._M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
      __x_33._M_str = (char *)in_stack_ffffffffffffdfb0;
      __x_33._M_len = (size_t)in_stack_ffffffffffffdfa8;
      __y_33._M_str._0_4_ = in_stack_ffffffffffffdfa0;
      __y_33._M_len = (size_t)in_stack_ffffffffffffdf98;
      __y_33._M_str._4_4_ = in_stack_ffffffffffffdfa4;
      bVar12 = std::operator==(__x_33,__y_33);
      if (bVar12) {
        pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49eeed);
        in_stack_ffffffffffffdf88 =
             *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
               **)&(pTVar13->loc).line;
        local_1208 = (pTVar13->loc).filename._M_len;
        in_stack_ffffffffffffdf80 =
             (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              *)(pTVar13->loc).filename._M_str;
        local_1210 = 0;
        local_1218 = 9;
        in_stack_ffffffffffffdf78 = (undefined4)local_1208;
        in_stack_ffffffffffffdf7c = (undefined4)(local_1208 >> 0x20);
        loc_10.filename._M_str = (char *)in_stack_ffffffffffffe1f8;
        loc_10.filename._M_len = (size_t)in_stack_ffffffffffffe1f0;
        loc_10._16_8_ = in_stack_ffffffffffffe200;
        pIStack_1200 = in_stack_ffffffffffffdf80;
        local_11f8 = in_stack_ffffffffffffdf88;
        parse::anon_class_48_6_0442aee5::operator()
                  (in_stack_ffffffffffffe1d0,
                   CONCAT44(in_stack_ffffffffffffe1c4,in_stack_ffffffffffffe1c0),loc_10);
      }
      else {
        pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49ef7e);
        local_1228 = (pTVar13->token)._M_len;
        local_1220 = (pTVar13->token)._M_str;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
        __x_34._M_str = (char *)in_stack_ffffffffffffdfb0;
        __x_34._M_len = (size_t)in_stack_ffffffffffffdfa8;
        __y_34._M_str._0_4_ = in_stack_ffffffffffffdfa0;
        __y_34._M_len = (size_t)in_stack_ffffffffffffdf98;
        __y_34._M_str._4_4_ = in_stack_ffffffffffffdfa4;
        bVar12 = std::operator==(__x_34,__y_34);
        if (bVar12) {
          pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49eff6);
          in_stack_ffffffffffffdf88 =
               *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                 **)&(pTVar13->loc).line;
          local_1258 = (pTVar13->loc).filename._M_len;
          in_stack_ffffffffffffdf80 =
               (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                *)(pTVar13->loc).filename._M_str;
          local_1260 = 0;
          local_1268 = 0xc9;
          in_stack_ffffffffffffdf78 = (undefined4)local_1258;
          in_stack_ffffffffffffdf7c = (undefined4)(local_1258 >> 0x20);
          loc_11.filename._M_str = (char *)in_stack_ffffffffffffe1f8;
          loc_11.filename._M_len = (size_t)in_stack_ffffffffffffe1f0;
          loc_11._16_8_ = in_stack_ffffffffffffe200;
          pIStack_1250 = in_stack_ffffffffffffdf80;
          local_1248 = in_stack_ffffffffffffdf88;
          parse::anon_class_48_6_0442aee5::operator()
                    (in_stack_ffffffffffffe1d0,
                     CONCAT44(in_stack_ffffffffffffe1c4,in_stack_ffffffffffffe1c0),loc_11);
        }
        else {
          pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49f087);
          local_1278 = (pTVar13->token)._M_len;
          local_1270 = (pTVar13->token)._M_str;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
          __x_35._M_str = (char *)in_stack_ffffffffffffdfb0;
          __x_35._M_len = (size_t)in_stack_ffffffffffffdfa8;
          __y_35._M_str._0_4_ = in_stack_ffffffffffffdfa0;
          __y_35._M_len = (size_t)in_stack_ffffffffffffdf98;
          __y_35._M_str._4_4_ = in_stack_ffffffffffffdfa4;
          bVar12 = std::operator==(__x_35,__y_35);
          if (bVar12) {
            for (local_1298 = 0; pTVar13 = local_8, fVar4 = local_1294[0], local_1298 < 3;
                local_1298 = local_1298 + 1) {
              std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                        ((function<pstd::optional<pbrt::Token>_(int)> *)in_stack_ffffffffffffdf98,
                         uVar1._4_4_);
              pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49f134);
              dVar16 = parseNumber((Token *)CONCAT44(in_stack_ffffffffffffe08c,
                                                     in_stack_ffffffffffffe088));
              local_1294[local_1298] = (float)dVar16;
              pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49f181);
            }
            in_stack_ffffffffffffe160 = local_1294[1];
            in_stack_ffffffffffffe164 = local_1294[2];
            in_stack_ffffffffffffe168 =
                 pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49f210);
            in_stack_ffffffffffffdf88 =
                 *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   **)&(in_stack_ffffffffffffe168->loc).line;
            local_12e8 = (in_stack_ffffffffffffe168->loc).filename._M_len;
            in_stack_ffffffffffffdf80 =
                 (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                  *)(in_stack_ffffffffffffe168->loc).filename._M_str;
            in_stack_ffffffffffffdf78 = (undefined4)local_12e8;
            in_stack_ffffffffffffdf7c = (undefined4)(local_12e8 >> 0x20);
            pIStack_12e0 = in_stack_ffffffffffffdf80;
            local_12d8 = in_stack_ffffffffffffdf88;
            (**(code **)(pTVar13->token)._M_len)
                      (fVar4,in_stack_ffffffffffffe160,in_stack_ffffffffffffe164);
          }
          else {
            pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49f294);
            parse::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)in_stack_ffffffffffffdfd0,
                       in_stack_ffffffffffffdfc8);
          }
        }
      }
      break;
    case 'T':
      pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49f2cd);
      local_12f8 = (pTVar13->token)._M_len;
      local_12f0 = (pTVar13->token)._M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
      __x_36._M_str = (char *)in_stack_ffffffffffffdfb0;
      __x_36._M_len = (size_t)in_stack_ffffffffffffdfa8;
      __y_36._M_str._0_4_ = in_stack_ffffffffffffdfa0;
      __y_36._M_len = (size_t)in_stack_ffffffffffffdf98;
      __y_36._M_str._4_4_ = in_stack_ffffffffffffdfa4;
      bVar12 = std::operator==(__x_36,__y_36);
      pTVar13 = local_8;
      if (bVar12) {
        pTVar15 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49f355);
        in_stack_ffffffffffffdf88 =
             *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
               **)&(pTVar15->loc).line;
        local_1328 = (pTVar15->loc).filename._M_len;
        in_stack_ffffffffffffdf80 =
             (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              *)(pTVar15->loc).filename._M_str;
        in_stack_ffffffffffffdf78 = (undefined4)local_1328;
        in_stack_ffffffffffffdf7c = (undefined4)(local_1328 >> 0x20);
        pIStack_1320 = in_stack_ffffffffffffdf80;
        local_1318 = in_stack_ffffffffffffdf88;
        (**(code **)((pTVar13->token)._M_len + 0xf0))();
      }
      else {
        pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49f3c5);
        local_1338 = (pTVar13->token)._M_len;
        local_1330 = (pTVar13->token)._M_str;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
        __x_37._M_str = (char *)in_stack_ffffffffffffdfb0;
        __x_37._M_len = (size_t)in_stack_ffffffffffffdfa8;
        __y_37._M_str._0_4_ = in_stack_ffffffffffffdfa0;
        __y_37._M_len = (size_t)in_stack_ffffffffffffdf98;
        __y_37._M_str._4_4_ = in_stack_ffffffffffffdfa4;
        bVar12 = std::operator==(__x_37,__y_37);
        pTVar13 = local_8;
        if (bVar12) {
          pTVar15 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49f44d);
          in_stack_ffffffffffffdf88 =
               *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                 **)&(pTVar15->loc).line;
          local_1368 = (pTVar15->loc).filename._M_len;
          in_stack_ffffffffffffdf80 =
               (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                *)(pTVar15->loc).filename._M_str;
          in_stack_ffffffffffffdf78 = (undefined4)local_1368;
          in_stack_ffffffffffffdf7c = (undefined4)(local_1368 >> 0x20);
          pIStack_1360 = in_stack_ffffffffffffdf80;
          local_1358 = in_stack_ffffffffffffdf88;
          (**(code **)((pTVar13->token)._M_len + 0xf8))();
        }
        else {
          pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49f4bd);
          local_1378 = (pTVar13->token)._M_len;
          local_1370 = (pTVar13->token)._M_str;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
          __x_38._M_str = (char *)in_stack_ffffffffffffdfb0;
          __x_38._M_len = (size_t)in_stack_ffffffffffffdfa8;
          __y_38._M_str._0_4_ = in_stack_ffffffffffffdfa0;
          __y_38._M_len = (size_t)in_stack_ffffffffffffdf98;
          __y_38._M_str._4_4_ = in_stack_ffffffffffffdfa4;
          bVar12 = std::operator==(__x_38,__y_38);
          if (bVar12) {
            std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                      ((function<pstd::optional<pbrt::Token>_(int)> *)in_stack_ffffffffffffdf98,
                       uVar1._4_4_);
            pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49f551);
            local_1398 = (pTVar13->token)._M_len;
            local_1390 = (pTVar13->token)._M_str;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
            __x_39._M_str = (char *)in_stack_ffffffffffffdfb0;
            __x_39._M_len = (size_t)in_stack_ffffffffffffdfa8;
            __y_39._M_str._0_4_ = in_stack_ffffffffffffdfa0;
            __y_39._M_len = (size_t)in_stack_ffffffffffffdf98;
            __y_39._M_str._4_4_ = in_stack_ffffffffffffdfa4;
            bVar12 = std::operator!=(__x_39,__y_39);
            pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49f5c7);
            if (bVar12) {
              pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49f5e1);
              parse::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)in_stack_ffffffffffffdfd0,
                         in_stack_ffffffffffffdfc8);
            }
            for (local_141c = 0; local_141c < 0x10; local_141c = local_141c + 1) {
              std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                        ((function<pstd::optional<pbrt::Token>_(int)> *)in_stack_ffffffffffffdf98,
                         uVar1._4_4_);
              pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49f66c);
              dVar16 = parseNumber((Token *)CONCAT44(in_stack_ffffffffffffe08c,
                                                     in_stack_ffffffffffffe088));
              local_1418[local_141c] = (float)dVar16;
              pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49f6b9);
            }
            std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                      ((function<pstd::optional<pbrt::Token>_(int)> *)in_stack_ffffffffffffdf98,
                       uVar1._4_4_);
            pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49f71e);
            local_1460 = (pTVar13->token)._M_len;
            local_1458 = (pTVar13->token)._M_str;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
            __x_40._M_str = (char *)in_stack_ffffffffffffdfb0;
            __x_40._M_len = (size_t)in_stack_ffffffffffffdfa8;
            __y_40._M_str._0_4_ = in_stack_ffffffffffffdfa0;
            __y_40._M_len = (size_t)in_stack_ffffffffffffdf98;
            __y_40._M_str._4_4_ = in_stack_ffffffffffffdfa4;
            bVar12 = std::operator!=(__x_40,__y_40);
            pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49f794);
            if (bVar12) {
              pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49f7ae);
              parse::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)in_stack_ffffffffffffdfd0,
                         in_stack_ffffffffffffdfc8);
            }
            pTVar13 = local_8;
            pTVar15 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49f824);
            in_stack_ffffffffffffdf88 =
                 *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   **)&(pTVar15->loc).line;
            local_14b8 = (pTVar15->loc).filename._M_len;
            in_stack_ffffffffffffdf80 =
                 (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                  *)(pTVar15->loc).filename._M_str;
            in_stack_ffffffffffffdf78 = (undefined4)local_14b8;
            in_stack_ffffffffffffdf7c = (undefined4)(local_14b8 >> 0x20);
            pIStack_14b0 = in_stack_ffffffffffffdf80;
            local_14a8 = in_stack_ffffffffffffdf88;
            (**(code **)((pTVar13->token)._M_len + 0x50))(pTVar13,local_1418);
          }
          else {
            pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49f899);
            local_14c8 = (pTVar13->token)._M_len;
            local_14c0 = (pTVar13->token)._M_str;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
            __x_41._M_str = (char *)in_stack_ffffffffffffdfb0;
            __x_41._M_len = (size_t)in_stack_ffffffffffffdfa8;
            __y_41._M_str._0_4_ = in_stack_ffffffffffffdfa0;
            __y_41._M_len = (size_t)in_stack_ffffffffffffdf98;
            __y_41._M_str._4_4_ = in_stack_ffffffffffffdfa4;
            bVar12 = std::operator==(__x_41,__y_41);
            if (bVar12) {
              for (local_14e8 = 0; pTVar13 = local_8, fVar5 = local_14e4[2], fVar4 = local_14e4[1],
                  local_14e8 < 3; local_14e8 = local_14e8 + 1) {
                std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                          ((function<pstd::optional<pbrt::Token>_(int)> *)in_stack_ffffffffffffdf98,
                           uVar1._4_4_);
                pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49f946);
                dVar16 = parseNumber((Token *)CONCAT44(in_stack_ffffffffffffe08c,
                                                       in_stack_ffffffffffffe088));
                local_14e4[local_14e8] = (float)dVar16;
                pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49f993);
              }
              in_stack_ffffffffffffe08c = local_14e4[0];
              pTVar15 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49fa22);
              in_stack_ffffffffffffdf88 =
                   *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                     **)&(pTVar15->loc).line;
              local_1538 = (pTVar15->loc).filename._M_len;
              in_stack_ffffffffffffdf80 =
                   (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                    *)(pTVar15->loc).filename._M_str;
              in_stack_ffffffffffffdf78 = (undefined4)local_1538;
              in_stack_ffffffffffffdf7c = (undefined4)(local_1538 >> 0x20);
              pIStack_1530 = in_stack_ffffffffffffdf80;
              local_1528 = in_stack_ffffffffffffdf88;
              (**(code **)((pTVar13->token)._M_len + 0x30))(in_stack_ffffffffffffe08c,fVar4,fVar5);
            }
            else {
              pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49faaa);
              local_1548 = (pTVar13->token)._M_len;
              local_1540 = (pTVar13->token)._M_str;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
              __x_42._M_str = (char *)in_stack_ffffffffffffdfb0;
              __x_42._M_len = (size_t)in_stack_ffffffffffffdfa8;
              __y_42._M_str._0_4_ = in_stack_ffffffffffffdfa0;
              __y_42._M_len = (size_t)in_stack_ffffffffffffdf98;
              __y_42._M_str._4_4_ = in_stack_ffffffffffffdfa4;
              bVar12 = std::operator==(__x_42,__y_42);
              if (bVar12) {
                for (local_1564 = 0; pTVar13 = local_8, fVar5 = local_1560[1], fVar4 = local_1560[0]
                    , local_1564 < 2; local_1564 = local_1564 + 1) {
                  std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                            ((function<pstd::optional<pbrt::Token>_(int)> *)
                             in_stack_ffffffffffffdf98,uVar1._4_4_);
                  pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49fb57);
                  dVar16 = parseNumber((Token *)CONCAT44(in_stack_ffffffffffffe08c,
                                                         in_stack_ffffffffffffe088));
                  local_1560[local_1564] = (float)dVar16;
                  pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49fba4);
                }
                pTVar15 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49fc21)
                ;
                in_stack_ffffffffffffdf88 =
                     *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                       **)&(pTVar15->loc).line;
                local_15b8 = (pTVar15->loc).filename._M_len;
                in_stack_ffffffffffffdf80 =
                     (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                      *)(pTVar15->loc).filename._M_str;
                in_stack_ffffffffffffdf78 = (undefined4)local_15b8;
                in_stack_ffffffffffffdf7c = (undefined4)(local_15b8 >> 0x20);
                pIStack_15b0 = in_stack_ffffffffffffdf80;
                local_15a8 = in_stack_ffffffffffffdf88;
                (**(code **)((pTVar13->token)._M_len + 0x80))(fVar4,fVar5);
              }
              else {
                pTVar13 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x49fca3)
                ;
                local_15c8 = (pTVar13->token)._M_len;
                local_15c0 = (pTVar13->token)._M_str;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88
                          );
                __x_43._M_str = (char *)in_stack_ffffffffffffdfb0;
                __x_43._M_len = (size_t)in_stack_ffffffffffffdfa8;
                __y_43._M_str._0_4_ = in_stack_ffffffffffffdfa0;
                __y_43._M_len = (size_t)in_stack_ffffffffffffdf98;
                __y_43._M_str._4_4_ = in_stack_ffffffffffffdfa4;
                bVar12 = std::operator==(__x_43,__y_43);
                if (bVar12) {
                  std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                            ((function<pstd::optional<pbrt::Token>_(int)> *)
                             in_stack_ffffffffffffdf98,uVar1._4_4_);
                  pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49fd37);
                  sVar18 = dequoteString(in_stack_ffffffffffffdfe8);
                  local_15e8 = sVar18;
                  pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49fd8d);
                  sVar18._M_str = (char *)in_stack_ffffffffffffdfc8;
                  sVar18._M_len = (size_t)in_stack_ffffffffffffdfc0;
                  local_1648 = local_15e8;
                  toString_abi_cxx11_(sVar18);
                  std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                            ((function<pstd::optional<pbrt::Token>_(int)> *)
                             in_stack_ffffffffffffdf98,uVar1._4_4_);
                  pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x49fde7);
                  sVar18 = dequoteString(in_stack_ffffffffffffdfe8);
                  in_stack_ffffffffffffe018 = (string *)sVar18._M_str;
                  local_1658 = sVar18;
                  local_15e8 = sVar18;
                  pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49fe4f);
                  s_10._M_str = (char *)in_stack_ffffffffffffdfc8;
                  s_10._M_len = (size_t)in_stack_ffffffffffffdfc0;
                  local_16b8 = local_15e8;
                  toString_abi_cxx11_(s_10);
                  std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                            ((function<pstd::optional<pbrt::Token>_(int)> *)
                             in_stack_ffffffffffffdf98,uVar1._4_4_);
                  pTVar13 = pstd::optional<pbrt::Token>::operator*
                                      ((optional<pbrt::Token> *)0x49fea9);
                  local_16c8._0_4_ = (pTVar13->loc).line;
                  local_16c8._4_4_ = (pTVar13->loc).column;
                  local_16e8 = (pTVar13->token)._M_len;
                  pcStack_16e0 = (pTVar13->token)._M_str;
                  sStack_16d8 = (pTVar13->loc).filename._M_len;
                  pcStack_16d0 = (pTVar13->loc).filename._M_str;
                  pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x49fee4);
                  sVar18 = dequoteString(in_stack_ffffffffffffdfe8);
                  s_11._M_str = (char *)in_stack_ffffffffffffdfc8;
                  s_11._M_len = (size_t)in_stack_ffffffffffffdfc0;
                  local_1758 = sVar18;
                  local_1728 = sVar18;
                  toString_abi_cxx11_(s_11);
                  std::function<pstd::optional<pbrt::Token>_(int)>::function
                            ((function<pstd::optional<pbrt::Token>_(int)> *)
                             CONCAT44(uVar1._4_4_,(undefined4)uVar1),
                             (function<pstd::optional<pbrt::Token>_(int)> *)
                             in_stack_ffffffffffffdf88);
                  local_17e0 = local_f0;
                  local_17e8 = local_40.memoryResource;
                  local_1810 = &local_99;
                  std::function<void(pbrt::Token_const&,char_const*)>::
                  function<pbrt::parse(pbrt::SceneRepresentation*,std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>)::__4,void>
                            ((function<void_(const_pbrt::Token_&,_const_char_*)> *)
                             CONCAT44(uVar1._4_4_,(undefined4)uVar1),
                             (anon_class_8_1_6195c8d3 *)in_stack_ffffffffffffdf88);
                  parseParameters<std::function<pstd::optional<pbrt::Token>(int)>,pbrt::parse(pbrt::SceneRepresentation*,std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>)::__5>
                            ((function<pstd::optional<pbrt::Token>_(int)> *)
                             in_stack_ffffffffffffe2f8,in_stack_ffffffffffffe308,
                             in_stack_ffffffffffffe300,sVar17._M_len._7_1_,
                             (function<void_(const_pbrt::Token_&,_const_char_*)> *)sVar17._M_str);
                  std::function<void_(const_pbrt::Token_&,_const_char_*)>::~function
                            ((function<void_(const_pbrt::Token_&,_const_char_*)> *)0x4a0009);
                  std::function<pstd::optional<pbrt::Token>_(int)>::~function
                            ((function<pstd::optional<pbrt::Token>_(int)> *)0x4a0016);
                  in_stack_ffffffffffffdfe8 = local_8;
                  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                  ::InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                                   *)CONCAT44(uVar1._4_4_,(undefined4)uVar1),
                                  in_stack_ffffffffffffdf88);
                  pTVar13 = pstd::optional<pbrt::Token>::operator->
                                      ((optional<pbrt::Token> *)0x4a0047);
                  in_stack_ffffffffffffdf88 =
                       *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                         **)&(pTVar13->loc).line;
                  sVar2 = (pTVar13->loc).filename._M_len;
                  in_stack_ffffffffffffdf80 =
                       (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                        *)(pTVar13->loc).filename._M_str;
                  in_stack_ffffffffffffdf78 = (undefined4)sVar2;
                  in_stack_ffffffffffffdf7c = (undefined4)(sVar2 >> 0x20);
                  (**(code **)((in_stack_ffffffffffffdfe8->token)._M_len + 0x100))
                            (in_stack_ffffffffffffdfe8,local_1638,local_16a8,local_1748,local_1870);
                  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                  ::~InlinedVector(in_stack_ffffffffffffdf80);
                  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                  ::~InlinedVector(in_stack_ffffffffffffdf80);
                  std::__cxx11::string::~string(local_1748);
                  std::__cxx11::string::~string(local_16a8);
                  std::__cxx11::string::~string(local_1638);
                }
                else {
                  pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x4a0269);
                  parse::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffdfd0,
                             in_stack_ffffffffffffdfc8);
                }
              }
            }
          }
        }
      }
      break;
    case 'W':
      in_stack_ffffffffffffdfd0 =
           pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x4a02a2);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
      __x_44._M_str = (char *)in_stack_ffffffffffffdfb0;
      __x_44._M_len = (size_t)in_stack_ffffffffffffdfa8;
      __y_44._M_str._0_4_ = in_stack_ffffffffffffdfa0;
      __y_44._M_len = (size_t)in_stack_ffffffffffffdf98;
      __y_44._M_str._4_4_ = in_stack_ffffffffffffdfa4;
      bVar12 = std::operator==(__x_44,__y_44);
      if (bVar12) {
        in_stack_ffffffffffffdfc0 = local_8;
        in_stack_ffffffffffffdfc8 =
             pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x4a031e);
        in_stack_ffffffffffffdf88 =
             *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
               **)&(in_stack_ffffffffffffdfc8->loc).line;
        sVar2 = (in_stack_ffffffffffffdfc8->loc).filename._M_len;
        in_stack_ffffffffffffdf80 =
             (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              *)(in_stack_ffffffffffffdfc8->loc).filename._M_str;
        in_stack_ffffffffffffdf78 = (undefined4)sVar2;
        in_stack_ffffffffffffdf7c = (undefined4)(sVar2 >> 0x20);
        (**(code **)((in_stack_ffffffffffffdfc0->token)._M_len + 0xd0))();
      }
      else {
        in_stack_ffffffffffffdfb8 =
             pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x4a0385);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(uVar1._4_4_,(undefined4)uVar1),(char *)in_stack_ffffffffffffdf88);
        __x_45._M_str = (char *)in_stack_ffffffffffffdfb0;
        __x_45._M_len = (size_t)in_stack_ffffffffffffdfa8;
        __y_45._M_str._0_4_ = in_stack_ffffffffffffdfa0;
        __y_45._M_len = (size_t)in_stack_ffffffffffffdf98;
        __y_45._M_str._4_4_ = in_stack_ffffffffffffdfa4;
        bVar12 = std::operator==(__x_45,__y_45);
        if ((!bVar12) || ((local_11[0] & 1) == 0)) {
          in_stack_ffffffffffffdfb0 =
               pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x4a0400);
          parse::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)in_stack_ffffffffffffdfd0,in_stack_ffffffffffffdfc8)
          ;
        }
      }
    }
  }
  CheckCallbackScope::~CheckCallbackScope
            ((CheckCallbackScope *)CONCAT44(in_stack_ffffffffffffdfa4,in_stack_ffffffffffffdfa0));
  pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x4a046a);
  std::function<pstd::optional<pbrt::Token>_(int)>::~function
            ((function<pstd::optional<pbrt::Token>_(int)> *)0x4a0477);
  pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x4a0484);
  std::
  vector<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
  ::~vector((vector<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
             *)CONCAT44(uVar1._4_4_,(undefined4)uVar1));
  TrackedMemoryResource::~TrackedMemoryResource((TrackedMemoryResource *)0x4a049e);
  return;
}

Assistant:

static void parse(SceneRepresentation *scene, std::unique_ptr<Tokenizer> t) {
    bool formatting = dynamic_cast<FormattingScene *>(scene) != nullptr;
    TrackedMemoryResource memoryResource;
    Allocator alloc(&memoryResource);

    std::vector<std::unique_ptr<Tokenizer>> fileStack;
    fileStack.push_back(std::move(t));

    pstd::optional<Token> ungetToken;

    auto parseError = [&](const char *msg, const FileLoc *loc) {
        ErrorExit(loc, "%s", msg);
    };

    // nextToken is a little helper function that handles the file stack,
    // returning the next token from the current file until reaching EOF,
    // at which point it switches to the next file (if any).
    std::function<pstd::optional<Token>(int)> nextToken;
    nextToken = [&](int flags) -> pstd::optional<Token> {
        if (ungetToken.has_value())
            return std::exchange(ungetToken, {});

        if (fileStack.empty()) {
            if ((flags & TokenRequired) != 0) {
                ErrorExit("premature end of file");
            }
            return {};
        }

        pstd::optional<Token> tok = fileStack.back()->Next();

        if (!tok) {
            // We've reached EOF in the current file. Anything more to parse?
            fileStack.pop_back();
            return nextToken(flags);
        } else if (tok->token[0] == '#') {
            // Swallow comments, unless --format or --toply was given, in
            // which case they're printed to stdout.
            if (formatting)
                printf("%s%s\n", dynamic_cast<FormattingScene *>(scene)->indent().c_str(),
                       toString(tok->token).c_str());
            return nextToken(flags);
        } else
            // Regular token; success.
            return tok;
    };

    auto unget = [&](Token t) {
        CHECK(!ungetToken.has_value());
        ungetToken = t;
    };

    // Helper function for pbrt API entrypoints that take a single string
    // parameter and a ParameterVector (e.g. pbrtShape()).
    // using BasicEntrypoint = void (ParsedScene::*)(const std::string &,
    // ParsedParameterVector, FileLoc);
    auto basicParamListEntrypoint = [&](void (SceneRepresentation::*apiFunc)(
                                            const std::string &, ParsedParameterVector,
                                            FileLoc),
                                        FileLoc loc) {
        Token t = *nextToken(TokenRequired);
        std::string_view dequoted = dequoteString(t);
        std::string n = toString(dequoted);
        ParsedParameterVector parameterVector = parseParameters(
            nextToken, unget, alloc, formatting, [&](const Token &t, const char *msg) {
                std::string token = toString(t.token);
                std::string str = StringPrintf("%s: %s", token, msg);
                parseError(str.c_str(), &t.loc);
            });
        (scene->*apiFunc)(n, std::move(parameterVector), loc);
    };

    auto syntaxError = [&](const Token &t) {
        ErrorExit(&t.loc, "Unknown directive: %s", toString(t.token));
    };

    pstd::optional<Token> tok;
    CheckCallbackScope _([&tok]() -> std::string {
        if (!tok.has_value())
            return "";
        std::string filename(tok->loc.filename.begin(), tok->loc.filename.end());
        return StringPrintf("Current parser location %s:%d:%d", filename, tok->loc.line,
                            tok->loc.column);
    });

    while (true) {
        tok = nextToken(TokenOptional);
        if (!tok.has_value())
            break;

        switch (tok->token[0]) {
        case 'A':
            if (tok->token == "AttributeBegin")
                scene->AttributeBegin(tok->loc);
            else if (tok->token == "AttributeEnd")
                scene->AttributeEnd(tok->loc);
            else if (tok->token == "Attribute")
                basicParamListEntrypoint(&SceneRepresentation::Attribute, tok->loc);
            else if (tok->token == "ActiveTransform") {
                Token a = *nextToken(TokenRequired);
                if (a.token == "All")
                    scene->ActiveTransformAll(tok->loc);
                else if (a.token == "EndTime")
                    scene->ActiveTransformEndTime(tok->loc);
                else if (a.token == "StartTime")
                    scene->ActiveTransformStartTime(tok->loc);
                else
                    syntaxError(*tok);
            } else if (tok->token == "AreaLightSource")
                basicParamListEntrypoint(&SceneRepresentation::AreaLightSource, tok->loc);
            else if (tok->token == "Accelerator")
                basicParamListEntrypoint(&SceneRepresentation::Accelerator, tok->loc);
            else
                syntaxError(*tok);
            break;

        case 'C':
            if (tok->token == "ConcatTransform") {
                if (nextToken(TokenRequired)->token != "[")
                    syntaxError(*tok);
                Float m[16];
                for (int i = 0; i < 16; ++i)
                    m[i] = parseNumber(*nextToken(TokenRequired));
                if (nextToken(TokenRequired)->token != "]")
                    syntaxError(*tok);
                scene->ConcatTransform(m, tok->loc);
            } else if (tok->token == "CoordinateSystem") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                scene->CoordinateSystem(toString(n), tok->loc);
            } else if (tok->token == "CoordSysTransform") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                scene->CoordSysTransform(toString(n), tok->loc);
            } else if (tok->token == "ColorSpace") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                scene->ColorSpace(toString(n), tok->loc);
            } else if (tok->token == "Camera")
                basicParamListEntrypoint(&SceneRepresentation::Camera, tok->loc);
            else
                syntaxError(*tok);
            break;

        case 'F':
            if (tok->token == "Film")
                basicParamListEntrypoint(&SceneRepresentation::Film, tok->loc);
            else
                syntaxError(*tok);
            break;

        case 'I':
            if (tok->token == "Integrator")
                basicParamListEntrypoint(&SceneRepresentation::Integrator, tok->loc);
            else if (tok->token == "Include") {
                Token filenameToken = *nextToken(TokenRequired);
                std::string filename = toString(dequoteString(filenameToken));
                if (formatting)
                    Printf("%sInclude \"%s\"\n",
                           dynamic_cast<FormattingScene *>(scene)->indent(), filename);
                else {
                    filename = ResolveFilename(filename);
                    std::unique_ptr<Tokenizer> tinc =
                        Tokenizer::CreateFromFile(filename, parseError);
                    if (tinc)
                        fileStack.push_back(std::move(tinc));
                }
            } else if (tok->token == "Identity")
                scene->Identity(tok->loc);
            else
                syntaxError(*tok);
            break;

        case 'L':
            if (tok->token == "LightSource")
                basicParamListEntrypoint(&SceneRepresentation::LightSource, tok->loc);
            else if (tok->token == "LookAt") {
                Float v[9];
                for (int i = 0; i < 9; ++i)
                    v[i] = parseNumber(*nextToken(TokenRequired));
                scene->LookAt(v[0], v[1], v[2], v[3], v[4], v[5], v[6], v[7], v[8],
                              tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'M':
            if (tok->token == "MakeNamedMaterial")
                basicParamListEntrypoint(&SceneRepresentation::MakeNamedMaterial,
                                         tok->loc);
            else if (tok->token == "MakeNamedMedium")
                basicParamListEntrypoint(&SceneRepresentation::MakeNamedMedium, tok->loc);
            else if (tok->token == "Material")
                basicParamListEntrypoint(&SceneRepresentation::Material, tok->loc);
            else if (tok->token == "MediumInterface") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                std::string names[2];
                names[0] = toString(n);

                // Check for optional second parameter
                pstd::optional<Token> second = nextToken(TokenOptional);
                if (second.has_value()) {
                    if (isQuotedString(second->token))
                        names[1] = toString(dequoteString(*second));
                    else {
                        unget(*second);
                        names[1] = names[0];
                    }
                } else
                    names[1] = names[0];

                scene->MediumInterface(names[0], names[1], tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'N':
            if (tok->token == "NamedMaterial") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                scene->NamedMaterial(toString(n), tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'O':
            if (tok->token == "ObjectBegin") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                scene->ObjectBegin(toString(n), tok->loc);
            } else if (tok->token == "ObjectEnd")
                scene->ObjectEnd(tok->loc);
            else if (tok->token == "ObjectInstance") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                scene->ObjectInstance(toString(n), tok->loc);
            } else if (tok->token == "Option") {
                std::string name = toString(dequoteString(*nextToken(TokenRequired)));
                std::string value = toString(nextToken(TokenRequired)->token);
                scene->Option(name, value, tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'P':
            if (tok->token == "PixelFilter")
                basicParamListEntrypoint(&SceneRepresentation::PixelFilter, tok->loc);
            else
                syntaxError(*tok);
            break;

        case 'R':
            if (tok->token == "ReverseOrientation")
                scene->ReverseOrientation(tok->loc);
            else if (tok->token == "Rotate") {
                Float v[4];
                for (int i = 0; i < 4; ++i)
                    v[i] = parseNumber(*nextToken(TokenRequired));
                scene->Rotate(v[0], v[1], v[2], v[3], tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'S':
            if (tok->token == "Shape")
                basicParamListEntrypoint(&SceneRepresentation::Shape, tok->loc);
            else if (tok->token == "Sampler")
                basicParamListEntrypoint(&SceneRepresentation::Sampler, tok->loc);
            else if (tok->token == "Scale") {
                Float v[3];
                for (int i = 0; i < 3; ++i)
                    v[i] = parseNumber(*nextToken(TokenRequired));
                scene->Scale(v[0], v[1], v[2], tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'T':
            if (tok->token == "TransformBegin")
                scene->TransformBegin(tok->loc);
            else if (tok->token == "TransformEnd")
                scene->TransformEnd(tok->loc);
            else if (tok->token == "Transform") {
                if (nextToken(TokenRequired)->token != "[")
                    syntaxError(*tok);
                Float m[16];
                for (int i = 0; i < 16; ++i)
                    m[i] = parseNumber(*nextToken(TokenRequired));
                if (nextToken(TokenRequired)->token != "]")
                    syntaxError(*tok);
                scene->Transform(m, tok->loc);
            } else if (tok->token == "Translate") {
                Float v[3];
                for (int i = 0; i < 3; ++i)
                    v[i] = parseNumber(*nextToken(TokenRequired));
                scene->Translate(v[0], v[1], v[2], tok->loc);
            } else if (tok->token == "TransformTimes") {
                Float v[2];
                for (int i = 0; i < 2; ++i)
                    v[i] = parseNumber(*nextToken(TokenRequired));
                scene->TransformTimes(v[0], v[1], tok->loc);
            } else if (tok->token == "Texture") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                std::string name = toString(n);
                n = dequoteString(*nextToken(TokenRequired));
                std::string type = toString(n);

                Token t = *nextToken(TokenRequired);
                std::string_view dequoted = dequoteString(t);
                std::string texName = toString(dequoted);
                ParsedParameterVector params = parseParameters(
                    nextToken, unget, alloc, formatting,
                    [&](const Token &t, const char *msg) {
                        std::string token = toString(t.token);
                        std::string str = StringPrintf("%s: %s", token, msg);
                        parseError(str.c_str(), &t.loc);
                    });

                scene->Texture(name, type, texName, std::move(params), tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'W':
            if (tok->token == "WorldBegin")
                scene->WorldBegin(tok->loc);
            else if (tok->token == "WorldEnd" && formatting)
                ;  // just swallow it
            else
                syntaxError(*tok);
            break;

        default:
            syntaxError(*tok);
        }
    }
}